

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx2::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  Primitive PVar8;
  Geometry *pGVar9;
  code *pcVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  long lVar23;
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  long lVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined1 auVar91 [32];
  undefined1 auVar92 [28];
  undefined1 auVar93 [28];
  undefined1 auVar94 [24];
  byte bVar95;
  int iVar96;
  uint uVar97;
  ulong uVar98;
  ulong uVar99;
  uint uVar100;
  ulong uVar101;
  ulong uVar102;
  long lVar103;
  undefined4 uVar104;
  undefined8 uVar105;
  float fVar121;
  vint4 bi_2;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar120;
  float fVar122;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar110 [16];
  undefined1 auVar119 [32];
  float fVar126;
  undefined8 uVar127;
  vint4 bi_1;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  float fVar140;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  float fVar141;
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar157;
  float fVar163;
  vint4 ai_2;
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  vint4 ai;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  vint4 bi;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [64];
  vint4 ai_1;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar195 [32];
  undefined1 auVar192 [32];
  undefined1 auVar194 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined4 uVar202;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  float fVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  RTCFilterFunctionNArguments args;
  undefined1 local_920 [32];
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined4 local_5c0;
  undefined4 uStack_5bc;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 uStack_5a8;
  undefined4 uStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  int local_340;
  int local_33c;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar152 [32];
  undefined1 auVar193 [16];
  
  PVar8 = prim[1];
  uVar98 = (ulong)(byte)PVar8;
  lVar77 = uVar98 * 0x19;
  fVar142 = *(float *)(prim + lVar77 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar12 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + lVar77 + 6));
  auVar106._0_4_ = fVar142 * auVar12._0_4_;
  auVar106._4_4_ = fVar142 * auVar12._4_4_;
  auVar106._8_4_ = fVar142 * auVar12._8_4_;
  auVar106._12_4_ = fVar142 * auVar12._12_4_;
  auVar171._0_4_ = fVar142 * auVar13._0_4_;
  auVar171._4_4_ = fVar142 * auVar13._4_4_;
  auVar171._8_4_ = fVar142 * auVar13._8_4_;
  auVar171._12_4_ = fVar142 * auVar13._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 5 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 6 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar98 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar101 = (ulong)(uint)((int)(uVar98 * 9) * 2);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 + 6)));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 + uVar98 + 6)));
  auVar108 = vcvtdq2ps_avx(auVar108);
  uVar101 = (ulong)(uint)((int)(uVar98 * 5) << 2);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 + 6)));
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar214._4_4_ = auVar171._0_4_;
  auVar214._0_4_ = auVar171._0_4_;
  auVar214._8_4_ = auVar171._0_4_;
  auVar214._12_4_ = auVar171._0_4_;
  auVar129 = vshufps_avx(auVar171,auVar171,0x55);
  auVar107 = vshufps_avx(auVar171,auVar171,0xaa);
  fVar142 = auVar107._0_4_;
  auVar203._0_4_ = fVar142 * auVar15._0_4_;
  fVar141 = auVar107._4_4_;
  auVar203._4_4_ = fVar141 * auVar15._4_4_;
  fVar120 = auVar107._8_4_;
  auVar203._8_4_ = fVar120 * auVar15._8_4_;
  fVar121 = auVar107._12_4_;
  auVar203._12_4_ = fVar121 * auVar15._12_4_;
  auVar200._0_4_ = auVar18._0_4_ * fVar142;
  auVar200._4_4_ = auVar18._4_4_ * fVar141;
  auVar200._8_4_ = auVar18._8_4_ * fVar120;
  auVar200._12_4_ = auVar18._12_4_ * fVar121;
  auVar189._0_4_ = auVar143._0_4_ * fVar142;
  auVar189._4_4_ = auVar143._4_4_ * fVar141;
  auVar189._8_4_ = auVar143._8_4_ * fVar120;
  auVar189._12_4_ = auVar143._12_4_ * fVar121;
  auVar107 = vfmadd231ps_fma(auVar203,auVar129,auVar13);
  auVar130 = vfmadd231ps_fma(auVar200,auVar129,auVar17);
  auVar129 = vfmadd231ps_fma(auVar189,auVar108,auVar129);
  auVar158 = vfmadd231ps_fma(auVar107,auVar214,auVar12);
  auVar207 = ZEXT1664(auVar158);
  auVar130 = vfmadd231ps_fma(auVar130,auVar214,auVar16);
  auVar165 = vfmadd231ps_fma(auVar129,auVar109,auVar214);
  auVar215._4_4_ = auVar106._0_4_;
  auVar215._0_4_ = auVar106._0_4_;
  auVar215._8_4_ = auVar106._0_4_;
  auVar215._12_4_ = auVar106._0_4_;
  auVar129 = vshufps_avx(auVar106,auVar106,0x55);
  auVar107 = vshufps_avx(auVar106,auVar106,0xaa);
  fVar142 = auVar107._0_4_;
  auVar172._0_4_ = fVar142 * auVar15._0_4_;
  fVar141 = auVar107._4_4_;
  auVar172._4_4_ = fVar141 * auVar15._4_4_;
  fVar120 = auVar107._8_4_;
  auVar172._8_4_ = fVar120 * auVar15._8_4_;
  fVar121 = auVar107._12_4_;
  auVar172._12_4_ = fVar121 * auVar15._12_4_;
  auVar128._0_4_ = auVar18._0_4_ * fVar142;
  auVar128._4_4_ = auVar18._4_4_ * fVar141;
  auVar128._8_4_ = auVar18._8_4_ * fVar120;
  auVar128._12_4_ = auVar18._12_4_ * fVar121;
  auVar107._0_4_ = auVar143._0_4_ * fVar142;
  auVar107._4_4_ = auVar143._4_4_ * fVar141;
  auVar107._8_4_ = auVar143._8_4_ * fVar120;
  auVar107._12_4_ = auVar143._12_4_ * fVar121;
  auVar13 = vfmadd231ps_fma(auVar172,auVar129,auVar13);
  auVar15 = vfmadd231ps_fma(auVar128,auVar129,auVar17);
  auVar17 = vfmadd231ps_fma(auVar107,auVar129,auVar108);
  auVar18 = vfmadd231ps_fma(auVar13,auVar215,auVar12);
  auVar108 = vfmadd231ps_fma(auVar15,auVar215,auVar16);
  auVar143 = vfmadd231ps_fma(auVar17,auVar215,auVar109);
  local_3d0._8_4_ = 0x7fffffff;
  local_3d0._0_8_ = 0x7fffffff7fffffff;
  local_3d0._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar158,local_3d0);
  auVar164._8_4_ = 0x219392ef;
  auVar164._0_8_ = 0x219392ef219392ef;
  auVar164._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar164,1);
  auVar13 = vblendvps_avx(auVar158,auVar164,auVar12);
  auVar12 = vandps_avx(auVar130,local_3d0);
  auVar12 = vcmpps_avx(auVar12,auVar164,1);
  auVar15 = vblendvps_avx(auVar130,auVar164,auVar12);
  auVar12 = vandps_avx(auVar165,local_3d0);
  auVar12 = vcmpps_avx(auVar12,auVar164,1);
  auVar12 = vblendvps_avx(auVar165,auVar164,auVar12);
  auVar16 = vrcpps_avx(auVar13);
  auVar185._8_4_ = 0x3f800000;
  auVar185._0_8_ = 0x3f8000003f800000;
  auVar185._12_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar13,auVar16,auVar185);
  auVar16 = vfmadd132ps_fma(auVar13,auVar16,auVar16);
  auVar13 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar13,auVar185);
  auVar17 = vfmadd132ps_fma(auVar15,auVar13,auVar13);
  auVar13 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar13,auVar185);
  auVar109 = vfmadd132ps_fma(auVar12,auVar13,auVar13);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar98 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar18);
  auVar165._0_4_ = auVar16._0_4_ * auVar12._0_4_;
  auVar165._4_4_ = auVar16._4_4_ * auVar12._4_4_;
  auVar165._8_4_ = auVar16._8_4_ * auVar12._8_4_;
  auVar165._12_4_ = auVar16._12_4_ * auVar12._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar98 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar13);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar18);
  auVar173._0_4_ = auVar16._0_4_ * auVar12._0_4_;
  auVar173._4_4_ = auVar16._4_4_ * auVar12._4_4_;
  auVar173._8_4_ = auVar16._8_4_ * auVar12._8_4_;
  auVar173._12_4_ = auVar16._12_4_ * auVar12._12_4_;
  auVar130._1_3_ = 0;
  auVar130[0] = PVar8;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar13 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar98 * -2 + 6);
  auVar12 = vpmovsxwd_avx(auVar16);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar108);
  auVar190._0_4_ = auVar12._0_4_ * auVar17._0_4_;
  auVar190._4_4_ = auVar12._4_4_ * auVar17._4_4_;
  auVar190._8_4_ = auVar12._8_4_ * auVar17._8_4_;
  auVar190._12_4_ = auVar12._12_4_ * auVar17._12_4_;
  auVar12 = vcvtdq2ps_avx(auVar13);
  auVar12 = vsubps_avx(auVar12,auVar108);
  auVar129._0_4_ = auVar17._0_4_ * auVar12._0_4_;
  auVar129._4_4_ = auVar17._4_4_ * auVar12._4_4_;
  auVar129._8_4_ = auVar17._8_4_ * auVar12._8_4_;
  auVar129._12_4_ = auVar17._12_4_ * auVar12._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar101 + uVar98 + 6);
  auVar12 = vpmovsxwd_avx(auVar17);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar143);
  auVar158._0_4_ = auVar109._0_4_ * auVar12._0_4_;
  auVar158._4_4_ = auVar109._4_4_ * auVar12._4_4_;
  auVar158._8_4_ = auVar109._8_4_ * auVar12._8_4_;
  auVar158._12_4_ = auVar109._12_4_ * auVar12._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar98 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar18);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar143);
  auVar108._0_4_ = auVar109._0_4_ * auVar12._0_4_;
  auVar108._4_4_ = auVar109._4_4_ * auVar12._4_4_;
  auVar108._8_4_ = auVar109._8_4_ * auVar12._8_4_;
  auVar108._12_4_ = auVar109._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar165,auVar173);
  auVar13 = vpminsd_avx(auVar190,auVar129);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  auVar13 = vpminsd_avx(auVar158,auVar108);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar193._4_4_ = uVar104;
  auVar193._0_4_ = uVar104;
  auVar193._8_4_ = uVar104;
  auVar193._12_4_ = uVar104;
  auVar199 = ZEXT1664(auVar193);
  auVar13 = vmaxps_avx(auVar13,auVar193);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  local_3e0._0_4_ = auVar12._0_4_ * 0.99999964;
  local_3e0._4_4_ = auVar12._4_4_ * 0.99999964;
  local_3e0._8_4_ = auVar12._8_4_ * 0.99999964;
  local_3e0._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar165,auVar173);
  auVar13 = vpmaxsd_avx(auVar190,auVar129);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar13 = vpmaxsd_avx(auVar158,auVar108);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar143._4_4_ = uVar104;
  auVar143._0_4_ = uVar104;
  auVar143._8_4_ = uVar104;
  auVar143._12_4_ = uVar104;
  auVar13 = vminps_avx(auVar13,auVar143);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar109._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar109._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar109._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar109._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar130[4] = PVar8;
  auVar130._5_3_ = 0;
  auVar130[8] = PVar8;
  auVar130._9_3_ = 0;
  auVar130[0xc] = PVar8;
  auVar130._13_3_ = 0;
  auVar13 = vpcmpgtd_avx(auVar130,_DAT_01f7fcf0);
  auVar12 = vcmpps_avx(local_3e0,auVar109,2);
  auVar12 = vandps_avx(auVar12,auVar13);
  uVar100 = vmovmskps_avx(auVar12);
  if (uVar100 == 0) {
    bVar95 = 0;
  }
  else {
    uVar100 = uVar100 & 0xff;
    local_5e0 = mm_lookupmask_ps._16_8_;
    uStack_5d8 = mm_lookupmask_ps._24_8_;
    uStack_5d0 = mm_lookupmask_ps._16_8_;
    uStack_5c8 = mm_lookupmask_ps._24_8_;
    iVar96 = 1 << ((uint)k & 0x1f);
    auVar111._4_4_ = iVar96;
    auVar111._0_4_ = iVar96;
    auVar111._8_4_ = iVar96;
    auVar111._12_4_ = iVar96;
    auVar111._16_4_ = iVar96;
    auVar111._20_4_ = iVar96;
    auVar111._24_4_ = iVar96;
    auVar111._28_4_ = iVar96;
    auVar137 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar111 = vpand_avx2(auVar111,auVar137);
    local_3c0 = vpcmpeqd_avx2(auVar111,auVar137);
    do {
      auVar111 = local_520;
      local_6e0 = auVar199._0_32_;
      auVar137 = auVar207._0_32_;
      lVar23 = 0;
      uVar101 = (ulong)uVar100;
      for (uVar98 = uVar101; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar101 = uVar101 - 1 & uVar101;
      local_540 = *(undefined4 *)(prim + lVar23 * 4 + 6);
      uVar98 = (ulong)(uint)((int)lVar23 << 6);
      uVar100 = *(uint *)(prim + 2);
      pGVar9 = (context->scene->geometries).items[uVar100].ptr;
      pPVar1 = prim + uVar98 + lVar77 + 0x16;
      uVar89 = *(undefined8 *)pPVar1;
      uVar90 = *(undefined8 *)(pPVar1 + 8);
      auVar13 = *(undefined1 (*) [16])pPVar1;
      auVar12 = *(undefined1 (*) [16])pPVar1;
      if (uVar101 != 0) {
        uVar102 = uVar101 - 1 & uVar101;
        for (uVar99 = uVar101; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
        }
        if (uVar102 != 0) {
          for (; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar15 = *(undefined1 (*) [16])(prim + uVar98 + lVar77 + 0x26);
      auVar16 = *(undefined1 (*) [16])(prim + uVar98 + lVar77 + 0x36);
      _local_5f0 = *(undefined1 (*) [16])(prim + uVar98 + lVar77 + 0x46);
      iVar96 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar108 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar18 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar108);
      uVar104 = auVar18._0_4_;
      auVar166._4_4_ = uVar104;
      auVar166._0_4_ = uVar104;
      auVar166._8_4_ = uVar104;
      auVar166._12_4_ = uVar104;
      auVar17 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      aVar5 = pre->ray_space[k].vx.field_0;
      aVar6 = pre->ray_space[k].vy.field_0;
      fVar142 = pre->ray_space[k].vz.field_0.m128[0];
      fVar141 = pre->ray_space[k].vz.field_0.m128[1];
      fVar120 = pre->ray_space[k].vz.field_0.m128[2];
      fVar121 = pre->ray_space[k].vz.field_0.m128[3];
      auVar180._0_4_ = fVar142 * auVar18._0_4_;
      auVar180._4_4_ = fVar141 * auVar18._4_4_;
      auVar180._8_4_ = fVar120 * auVar18._8_4_;
      auVar180._12_4_ = fVar121 * auVar18._12_4_;
      auVar17 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar6,auVar17);
      auVar129 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar166);
      auVar17 = vblendps_avx(auVar129,*(undefined1 (*) [16])pPVar1,8);
      auVar109 = vsubps_avx(auVar15,auVar108);
      uVar104 = auVar109._0_4_;
      auVar181._4_4_ = uVar104;
      auVar181._0_4_ = uVar104;
      auVar181._8_4_ = uVar104;
      auVar181._12_4_ = uVar104;
      auVar18 = vshufps_avx(auVar109,auVar109,0x55);
      auVar109 = vshufps_avx(auVar109,auVar109,0xaa);
      auVar194._0_4_ = fVar142 * auVar109._0_4_;
      auVar194._4_4_ = fVar141 * auVar109._4_4_;
      auVar194._8_4_ = fVar120 * auVar109._8_4_;
      auVar194._12_4_ = fVar121 * auVar109._12_4_;
      auVar18 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar6,auVar18);
      auVar107 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar5,auVar181);
      auVar18 = vblendps_avx(auVar107,auVar15,8);
      auVar143 = vsubps_avx(auVar16,auVar108);
      uVar104 = auVar143._0_4_;
      auVar186._4_4_ = uVar104;
      auVar186._0_4_ = uVar104;
      auVar186._8_4_ = uVar104;
      auVar186._12_4_ = uVar104;
      auVar109 = vshufps_avx(auVar143,auVar143,0x55);
      auVar143 = vshufps_avx(auVar143,auVar143,0xaa);
      auVar204._0_4_ = fVar142 * auVar143._0_4_;
      auVar204._4_4_ = fVar141 * auVar143._4_4_;
      auVar204._8_4_ = fVar120 * auVar143._8_4_;
      auVar204._12_4_ = fVar121 * auVar143._12_4_;
      auVar109 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar6,auVar109);
      auVar130 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar5,auVar186);
      auVar109 = vblendps_avx(auVar130,auVar16,8);
      auVar143 = vsubps_avx(_local_5f0,auVar108);
      uVar104 = auVar143._0_4_;
      auVar187._4_4_ = uVar104;
      auVar187._0_4_ = uVar104;
      auVar187._8_4_ = uVar104;
      auVar187._12_4_ = uVar104;
      auVar108 = vshufps_avx(auVar143,auVar143,0x55);
      auVar143 = vshufps_avx(auVar143,auVar143,0xaa);
      auVar209._0_4_ = fVar142 * auVar143._0_4_;
      auVar209._4_4_ = fVar141 * auVar143._4_4_;
      auVar209._8_4_ = fVar120 * auVar143._8_4_;
      auVar209._12_4_ = fVar121 * auVar143._12_4_;
      auVar108 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar6,auVar108);
      auVar158 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar5,auVar187);
      auVar108 = vblendps_avx(auVar158,_local_5f0,8);
      auVar17 = vandps_avx(auVar17,local_3d0);
      auVar18 = vandps_avx(auVar18,local_3d0);
      auVar143 = vmaxps_avx(auVar17,auVar18);
      auVar17 = vandps_avx(auVar109,local_3d0);
      auVar18 = vandps_avx(auVar108,local_3d0);
      auVar17 = vmaxps_avx(auVar17,auVar18);
      auVar17 = vmaxps_avx(auVar143,auVar17);
      auVar18 = vmovshdup_avx(auVar17);
      auVar18 = vmaxss_avx(auVar18,auVar17);
      auVar17 = vshufpd_avx(auVar17,auVar17,1);
      auVar17 = vmaxss_avx(auVar17,auVar18);
      lVar23 = (long)iVar96 * 0x44;
      auVar18 = vmovshdup_avx(auVar129);
      uVar105 = auVar18._0_8_;
      local_5a0._8_8_ = uVar105;
      local_5a0._0_8_ = uVar105;
      local_5a0._16_8_ = uVar105;
      local_5a0._24_8_ = uVar105;
      auVar18 = vmovshdup_avx(auVar107);
      uVar105 = auVar18._0_8_;
      auVar219._8_8_ = uVar105;
      auVar219._0_8_ = uVar105;
      auVar219._16_8_ = uVar105;
      auVar219._24_8_ = uVar105;
      auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x908);
      uVar202 = auVar130._0_4_;
      auVar149._4_4_ = uVar202;
      auVar149._0_4_ = uVar202;
      auVar149._8_4_ = uVar202;
      auVar149._12_4_ = uVar202;
      auVar149._16_4_ = uVar202;
      auVar149._20_4_ = uVar202;
      auVar149._24_4_ = uVar202;
      auVar149._28_4_ = uVar202;
      auVar18 = vmovshdup_avx(auVar130);
      uVar105 = auVar18._0_8_;
      auVar205._8_8_ = uVar105;
      auVar205._0_8_ = uVar105;
      auVar205._16_8_ = uVar105;
      auVar205._24_8_ = uVar105;
      fVar142 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar23 + 0xd8c);
      auVar92 = *(undefined1 (*) [28])(bezier_basis0 + lVar23 + 0xd8c);
      fVar208 = auVar158._0_4_;
      auVar18 = vmovshdup_avx(auVar158);
      uVar105 = auVar18._0_8_;
      auVar179._4_4_ = fVar208 * *(float *)(bezier_basis0 + lVar23 + 0xd90);
      auVar179._0_4_ = fVar208 * fVar142;
      auVar179._8_4_ = fVar208 * *(float *)(bezier_basis0 + lVar23 + 0xd94);
      auVar179._12_4_ = fVar208 * *(float *)(bezier_basis0 + lVar23 + 0xd98);
      auVar179._16_4_ = fVar208 * *(float *)(bezier_basis0 + lVar23 + 0xd9c);
      auVar179._20_4_ = fVar208 * *(float *)(bezier_basis0 + lVar23 + 0xda0);
      auVar179._24_4_ = fVar208 * *(float *)(bezier_basis0 + lVar23 + 0xda4);
      auVar179._28_4_ = *(undefined4 *)(bezier_basis0 + lVar23 + 0xda8);
      auVar109 = vfmadd231ps_fma(auVar179,auVar118,auVar149);
      fVar157 = auVar18._0_4_;
      auVar154._0_4_ = fVar157 * fVar142;
      fVar163 = auVar18._4_4_;
      auVar154._4_4_ = fVar163 * *(float *)(bezier_basis0 + lVar23 + 0xd90);
      auVar154._8_4_ = fVar157 * *(float *)(bezier_basis0 + lVar23 + 0xd94);
      auVar154._12_4_ = fVar163 * *(float *)(bezier_basis0 + lVar23 + 0xd98);
      auVar154._16_4_ = fVar157 * *(float *)(bezier_basis0 + lVar23 + 0xd9c);
      auVar154._20_4_ = fVar163 * *(float *)(bezier_basis0 + lVar23 + 0xda0);
      auVar154._24_4_ = fVar157 * *(float *)(bezier_basis0 + lVar23 + 0xda4);
      auVar154._28_4_ = 0;
      auVar18 = vfmadd231ps_fma(auVar154,auVar118,auVar205);
      auVar179 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x484);
      uVar104 = auVar107._0_4_;
      auVar201._4_4_ = uVar104;
      auVar201._0_4_ = uVar104;
      auVar201._8_4_ = uVar104;
      auVar201._12_4_ = uVar104;
      auVar201._16_4_ = uVar104;
      auVar201._20_4_ = uVar104;
      auVar201._24_4_ = uVar104;
      auVar201._28_4_ = uVar104;
      auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar179,auVar201);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar179,auVar219);
      auVar154 = *(undefined1 (*) [32])(bezier_basis0 + lVar23);
      local_580._0_4_ = auVar129._0_4_;
      auVar216._4_4_ = local_580._0_4_;
      auVar216._0_4_ = local_580._0_4_;
      auVar216._8_4_ = local_580._0_4_;
      auVar216._12_4_ = local_580._0_4_;
      auVar216._16_4_ = local_580._0_4_;
      auVar216._20_4_ = local_580._0_4_;
      auVar216._24_4_ = local_580._0_4_;
      auVar216._28_4_ = local_580._0_4_;
      auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar154,auVar216);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar154,local_5a0);
      local_4a0 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x908);
      fVar125 = *(float *)(bezier_basis1 + lVar23 + 0xd8c);
      fVar78 = *(float *)(bezier_basis1 + lVar23 + 0xd90);
      fVar79 = *(float *)(bezier_basis1 + lVar23 + 0xd94);
      fVar80 = *(float *)(bezier_basis1 + lVar23 + 0xd98);
      fVar81 = *(float *)(bezier_basis1 + lVar23 + 0xd9c);
      fVar82 = *(float *)(bezier_basis1 + lVar23 + 0xda0);
      fVar83 = *(float *)(bezier_basis1 + lVar23 + 0xda4);
      auVar7._4_4_ = fVar78 * fVar208;
      auVar7._0_4_ = fVar125 * fVar208;
      auVar7._8_4_ = fVar79 * fVar208;
      auVar7._12_4_ = fVar80 * fVar208;
      auVar7._16_4_ = fVar81 * fVar208;
      auVar7._20_4_ = fVar82 * fVar208;
      auVar7._24_4_ = fVar83 * fVar208;
      auVar7._28_4_ = *(undefined4 *)(bezier_basis0 + lVar23 + 0xda8);
      auVar108 = vfmadd231ps_fma(auVar7,local_4a0,auVar149);
      auVar14._4_4_ = fVar78 * fVar163;
      auVar14._0_4_ = fVar125 * fVar157;
      auVar14._8_4_ = fVar79 * fVar157;
      auVar14._12_4_ = fVar80 * fVar163;
      auVar14._16_4_ = fVar81 * fVar157;
      auVar14._20_4_ = fVar82 * fVar163;
      auVar14._24_4_ = fVar83 * fVar157;
      auVar14._28_4_ = uVar202;
      auVar143 = vfmadd231ps_fma(auVar14,local_4a0,auVar205);
      auVar7 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x484);
      auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar7,auVar201);
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar7,auVar219);
      local_6c0 = *(undefined1 (*) [32])(bezier_basis1 + lVar23);
      auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),local_6c0,auVar216);
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),local_6c0,local_5a0);
      local_420 = ZEXT1632(auVar108);
      local_400 = ZEXT1632(auVar109);
      auVar191 = vsubps_avx(local_420,local_400);
      local_440 = ZEXT1632(auVar143);
      _local_460 = ZEXT1632(auVar18);
      _local_480 = vsubps_avx(local_440,_local_460);
      auVar112._0_4_ = auVar18._0_4_ * auVar191._0_4_;
      auVar112._4_4_ = auVar18._4_4_ * auVar191._4_4_;
      auVar112._8_4_ = auVar18._8_4_ * auVar191._8_4_;
      auVar112._12_4_ = auVar18._12_4_ * auVar191._12_4_;
      auVar112._16_4_ = auVar191._16_4_ * 0.0;
      auVar112._20_4_ = auVar191._20_4_ * 0.0;
      auVar112._24_4_ = auVar191._24_4_ * 0.0;
      auVar112._28_4_ = 0;
      fVar142 = local_480._0_4_;
      auVar131._0_4_ = auVar109._0_4_ * fVar142;
      fVar141 = local_480._4_4_;
      auVar131._4_4_ = auVar109._4_4_ * fVar141;
      fVar120 = local_480._8_4_;
      auVar131._8_4_ = auVar109._8_4_ * fVar120;
      fVar121 = local_480._12_4_;
      auVar131._12_4_ = auVar109._12_4_ * fVar121;
      fVar122 = local_480._16_4_;
      auVar131._16_4_ = fVar122 * 0.0;
      fVar123 = local_480._20_4_;
      auVar131._20_4_ = fVar123 * 0.0;
      fVar124 = local_480._24_4_;
      auVar131._24_4_ = fVar124 * 0.0;
      auVar131._28_4_ = 0;
      auVar112 = vsubps_avx(auVar112,auVar131);
      auVar18 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar127 = auVar18._0_8_;
      local_80._8_8_ = uVar127;
      local_80._0_8_ = uVar127;
      local_80._16_8_ = uVar127;
      local_80._24_8_ = uVar127;
      auVar109 = vpermilps_avx(auVar15,0xff);
      uVar127 = auVar109._0_8_;
      local_a0._8_8_ = uVar127;
      local_a0._0_8_ = uVar127;
      local_a0._16_8_ = uVar127;
      local_a0._24_8_ = uVar127;
      auVar109 = vpermilps_avx(auVar16,0xff);
      uVar127 = auVar109._0_8_;
      local_c0._8_8_ = uVar127;
      local_c0._0_8_ = uVar127;
      local_c0._16_8_ = uVar127;
      local_c0._24_8_ = uVar127;
      auVar109 = vpermilps_avx(_local_5f0,0xff);
      local_e0 = auVar109._0_8_;
      local_820._0_4_ = auVar92._0_4_;
      local_820._4_4_ = auVar92._4_4_;
      fStack_818 = auVar92._8_4_;
      fStack_814 = auVar92._12_4_;
      fStack_810 = auVar92._16_4_;
      fStack_80c = auVar92._20_4_;
      fStack_808 = auVar92._24_4_;
      fVar126 = auVar109._0_4_;
      fVar140 = auVar109._4_4_;
      auVar119._4_4_ = fVar140 * (float)local_820._4_4_;
      auVar119._0_4_ = fVar126 * (float)local_820._0_4_;
      auVar119._8_4_ = fVar126 * fStack_818;
      auVar119._12_4_ = fVar140 * fStack_814;
      auVar119._16_4_ = fVar126 * fStack_810;
      auVar119._20_4_ = fVar140 * fStack_80c;
      auVar119._24_4_ = fVar126 * fStack_808;
      auVar119._28_4_ = local_580._0_4_;
      auVar109 = vfmadd231ps_fma(auVar119,local_c0,auVar118);
      auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar179,local_a0);
      auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar154,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar22._4_4_ = fVar78 * fVar140;
      auVar22._0_4_ = fVar125 * fVar126;
      auVar22._8_4_ = fVar79 * fVar126;
      auVar22._12_4_ = fVar80 * fVar140;
      auVar22._16_4_ = fVar81 * fVar126;
      auVar22._20_4_ = fVar82 * fVar140;
      auVar22._24_4_ = fVar83 * fVar126;
      auVar22._28_4_ = auVar154._28_4_;
      auVar108 = vfmadd231ps_fma(auVar22,local_4a0,local_c0);
      auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar7,local_a0);
      auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),local_6c0,local_80);
      auVar195._4_4_ = fVar141 * fVar141;
      auVar195._0_4_ = fVar142 * fVar142;
      auVar195._8_4_ = fVar120 * fVar120;
      auVar195._12_4_ = fVar121 * fVar121;
      auVar195._16_4_ = fVar122 * fVar122;
      auVar195._20_4_ = fVar123 * fVar123;
      auVar195._24_4_ = fVar124 * fVar124;
      auVar195._28_4_ = auVar18._4_4_;
      auVar18 = vfmadd231ps_fma(auVar195,auVar191,auVar191);
      auVar14 = vmaxps_avx(ZEXT1632(auVar109),ZEXT1632(auVar108));
      auVar20._4_4_ = auVar14._4_4_ * auVar14._4_4_ * auVar18._4_4_;
      auVar20._0_4_ = auVar14._0_4_ * auVar14._0_4_ * auVar18._0_4_;
      auVar20._8_4_ = auVar14._8_4_ * auVar14._8_4_ * auVar18._8_4_;
      auVar20._12_4_ = auVar14._12_4_ * auVar14._12_4_ * auVar18._12_4_;
      auVar20._16_4_ = auVar14._16_4_ * auVar14._16_4_ * 0.0;
      auVar20._20_4_ = auVar14._20_4_ * auVar14._20_4_ * 0.0;
      auVar20._24_4_ = auVar14._24_4_ * auVar14._24_4_ * 0.0;
      auVar20._28_4_ = auVar14._28_4_;
      auVar21._4_4_ = auVar112._4_4_ * auVar112._4_4_;
      auVar21._0_4_ = auVar112._0_4_ * auVar112._0_4_;
      auVar21._8_4_ = auVar112._8_4_ * auVar112._8_4_;
      auVar21._12_4_ = auVar112._12_4_ * auVar112._12_4_;
      auVar21._16_4_ = auVar112._16_4_ * auVar112._16_4_;
      auVar21._20_4_ = auVar112._20_4_ * auVar112._20_4_;
      auVar21._24_4_ = auVar112._24_4_ * auVar112._24_4_;
      auVar21._28_4_ = auVar112._28_4_;
      auVar14 = vcmpps_avx(auVar21,auVar20,2);
      fVar142 = auVar17._0_4_ * 4.7683716e-07;
      auVar113._0_4_ = (float)iVar96;
      local_520._4_12_ = auVar158._4_12_;
      local_520._0_4_ = auVar113._0_4_;
      local_520._16_16_ = auVar111._16_16_;
      auVar113._4_4_ = auVar113._0_4_;
      auVar113._8_4_ = auVar113._0_4_;
      auVar113._12_4_ = auVar113._0_4_;
      auVar113._16_4_ = auVar113._0_4_;
      auVar113._20_4_ = auVar113._0_4_;
      auVar113._24_4_ = auVar113._0_4_;
      auVar113._28_4_ = auVar113._0_4_;
      auVar111 = vcmpps_avx(_DAT_01faff40,auVar113,1);
      auVar18 = vpermilps_avx(auVar129,0xaa);
      uVar127 = auVar18._0_8_;
      auVar159._8_8_ = uVar127;
      auVar159._0_8_ = uVar127;
      auVar159._16_8_ = uVar127;
      auVar159._24_8_ = uVar127;
      auVar17 = vpermilps_avx(auVar107,0xaa);
      uVar127 = auVar17._0_8_;
      local_100._8_8_ = uVar127;
      local_100._0_8_ = uVar127;
      local_100._16_8_ = uVar127;
      local_100._24_8_ = uVar127;
      auVar17 = vpermilps_avx(auVar130,0xaa);
      uVar127 = auVar17._0_8_;
      local_580._8_8_ = uVar127;
      local_580._0_8_ = uVar127;
      local_580._16_8_ = uVar127;
      local_580._24_8_ = uVar127;
      auVar17 = vshufps_avx(auVar158,auVar158,0xaa);
      uVar127 = auVar17._0_8_;
      register0x00001508 = uVar127;
      local_700 = uVar127;
      register0x00001510 = uVar127;
      register0x00001518 = uVar127;
      auVar112 = auVar111 & auVar14;
      uVar97 = *(uint *)(ray + k * 4 + 0x60);
      local_660._0_16_ = ZEXT416(uVar97);
      local_740 = auVar15._0_8_;
      uStack_738 = auVar15._8_8_;
      local_750 = auVar16._0_8_;
      uStack_748 = auVar16._8_8_;
      if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar112 >> 0x7f,0) == '\0') &&
            (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar112 >> 0xbf,0) == '\0') &&
          (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar112[0x1f]) {
        auVar207 = ZEXT3264(auVar137);
        auVar188 = ZEXT3264(CONCAT428(fVar208,CONCAT424(fVar208,CONCAT420(fVar208,CONCAT416(fVar208,
                                                  CONCAT412(fVar208,CONCAT48(fVar208,CONCAT44(
                                                  fVar208,fVar208))))))));
        auVar184 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar157,CONCAT420(fVar163,CONCAT416(fVar157,
                                                  CONCAT412(fVar163,CONCAT48(fVar157,uVar105)))))));
LAB_015a16d0:
        auVar213 = ZEXT3264(_local_700);
        uVar98 = 0;
      }
      else {
        local_5c0 = SUB84(pGVar9,0);
        uStack_5bc = (undefined4)((ulong)pGVar9 >> 0x20);
        _local_4c0 = vandps_avx(auVar14,auVar111);
        fVar126 = auVar17._0_4_;
        fVar140 = auVar17._4_4_;
        auVar19._4_4_ = fVar140 * fVar78;
        auVar19._0_4_ = fVar126 * fVar125;
        auVar19._8_4_ = fVar126 * fVar79;
        auVar19._12_4_ = fVar140 * fVar80;
        auVar19._16_4_ = fVar126 * fVar81;
        auVar19._20_4_ = fVar140 * fVar82;
        auVar19._24_4_ = fVar126 * fVar83;
        auVar19._28_4_ = local_4c0._28_4_;
        auVar17 = vfmadd213ps_fma(local_4a0,local_580,auVar19);
        auVar17 = vfmadd213ps_fma(auVar7,local_100,ZEXT1632(auVar17));
        auVar17 = vfmadd213ps_fma(local_6c0,auVar159,ZEXT1632(auVar17));
        local_6c0 = ZEXT1632(auVar17);
        auVar114._0_4_ = fVar126 * (float)local_820._0_4_;
        auVar114._4_4_ = fVar140 * (float)local_820._4_4_;
        auVar114._8_4_ = fVar126 * fStack_818;
        auVar114._12_4_ = fVar140 * fStack_814;
        auVar114._16_4_ = fVar126 * fStack_810;
        auVar114._20_4_ = fVar140 * fStack_80c;
        auVar114._24_4_ = fVar126 * fStack_808;
        auVar114._28_4_ = 0;
        auVar17 = vfmadd213ps_fma(auVar118,local_580,auVar114);
        auVar17 = vfmadd213ps_fma(auVar179,local_100,ZEXT1632(auVar17));
        auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1210);
        auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1694);
        auVar179 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1b18);
        fVar141 = *(float *)(bezier_basis0 + lVar23 + 0x1f9c);
        fVar120 = *(float *)(bezier_basis0 + lVar23 + 0x1fa0);
        fVar121 = *(float *)(bezier_basis0 + lVar23 + 0x1fa4);
        fVar122 = *(float *)(bezier_basis0 + lVar23 + 0x1fa8);
        fVar123 = *(float *)(bezier_basis0 + lVar23 + 0x1fac);
        fVar124 = *(float *)(bezier_basis0 + lVar23 + 0x1fb0);
        fVar125 = *(float *)(bezier_basis0 + lVar23 + 0x1fb4);
        auVar217._4_4_ = fVar208 * fVar120;
        auVar217._0_4_ = fVar208 * fVar141;
        auVar217._8_4_ = fVar208 * fVar121;
        auVar217._12_4_ = fVar208 * fVar122;
        auVar217._16_4_ = fVar208 * fVar123;
        auVar217._20_4_ = fVar208 * fVar124;
        auVar217._24_4_ = fVar208 * fVar125;
        auVar217._28_4_ = local_480._28_4_;
        auVar25._4_4_ = fVar163 * fVar120;
        auVar25._0_4_ = fVar157 * fVar141;
        auVar25._8_4_ = fVar157 * fVar121;
        auVar25._12_4_ = fVar163 * fVar122;
        auVar25._16_4_ = fVar157 * fVar123;
        auVar25._20_4_ = fVar163 * fVar124;
        auVar25._24_4_ = fVar157 * fVar125;
        auVar25._28_4_ = *(undefined4 *)(bezier_basis1 + lVar23 + 0xda8);
        auVar26._4_4_ = fVar140 * fVar120;
        auVar26._0_4_ = fVar126 * fVar141;
        auVar26._8_4_ = fVar126 * fVar121;
        auVar26._12_4_ = fVar140 * fVar122;
        auVar26._16_4_ = fVar126 * fVar123;
        auVar26._20_4_ = fVar140 * fVar124;
        auVar26._24_4_ = fVar126 * fVar125;
        auVar26._28_4_ = auVar191._28_4_;
        auVar143 = vfmadd231ps_fma(auVar217,auVar179,auVar149);
        auVar129 = vfmadd231ps_fma(auVar25,auVar179,auVar205);
        auVar107 = vfmadd231ps_fma(auVar26,local_580,auVar179);
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar118,auVar201);
        auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar118,auVar219);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_100,auVar118);
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar111,auVar216);
        auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar111,local_5a0);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar159,auVar111);
        fVar141 = *(float *)(bezier_basis1 + lVar23 + 0x1f9c);
        fVar120 = *(float *)(bezier_basis1 + lVar23 + 0x1fa0);
        fVar121 = *(float *)(bezier_basis1 + lVar23 + 0x1fa4);
        fVar122 = *(float *)(bezier_basis1 + lVar23 + 0x1fa8);
        fVar123 = *(float *)(bezier_basis1 + lVar23 + 0x1fac);
        fVar124 = *(float *)(bezier_basis1 + lVar23 + 0x1fb0);
        fVar125 = *(float *)(bezier_basis1 + lVar23 + 0x1fb4);
        auVar118._4_4_ = fVar208 * fVar120;
        auVar118._0_4_ = fVar208 * fVar141;
        auVar118._8_4_ = fVar208 * fVar121;
        auVar118._12_4_ = fVar208 * fVar122;
        auVar118._16_4_ = fVar208 * fVar123;
        auVar118._20_4_ = fVar208 * fVar124;
        auVar118._24_4_ = fVar208 * fVar125;
        auVar118._28_4_ = fVar208;
        auVar27._4_4_ = fVar163 * fVar120;
        auVar27._0_4_ = fVar157 * fVar141;
        auVar27._8_4_ = fVar157 * fVar121;
        auVar27._12_4_ = fVar163 * fVar122;
        auVar27._16_4_ = fVar157 * fVar123;
        auVar27._20_4_ = fVar163 * fVar124;
        auVar27._24_4_ = fVar157 * fVar125;
        auVar27._28_4_ = fVar163;
        auVar28._4_4_ = fVar120 * fVar140;
        auVar28._0_4_ = fVar141 * fVar126;
        auVar28._8_4_ = fVar121 * fVar126;
        auVar28._12_4_ = fVar122 * fVar140;
        auVar28._16_4_ = fVar123 * fVar126;
        auVar28._20_4_ = fVar124 * fVar140;
        auVar28._24_4_ = fVar125 * fVar126;
        auVar28._28_4_ = auVar18._4_4_;
        auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1b18);
        auVar18 = vfmadd231ps_fma(auVar118,auVar111,auVar149);
        auVar130 = vfmadd231ps_fma(auVar27,auVar111,auVar205);
        auVar158 = vfmadd231ps_fma(auVar28,auVar111,local_580);
        auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1694);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar111,auVar201);
        auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar111,auVar219);
        auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),local_100,auVar111);
        auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1210);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar111,auVar216);
        auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar111,local_5a0);
        auVar132._8_4_ = 0x7fffffff;
        auVar132._0_8_ = 0x7fffffff7fffffff;
        auVar132._12_4_ = 0x7fffffff;
        auVar132._16_4_ = 0x7fffffff;
        auVar132._20_4_ = 0x7fffffff;
        auVar132._24_4_ = 0x7fffffff;
        auVar132._28_4_ = 0x7fffffff;
        auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar159,auVar111);
        auVar111 = vandps_avx(ZEXT1632(auVar143),auVar132);
        auVar118 = vandps_avx(ZEXT1632(auVar129),auVar132);
        auVar118 = vmaxps_avx(auVar111,auVar118);
        auVar111 = vandps_avx(ZEXT1632(auVar107),auVar132);
        auVar111 = vmaxps_avx(auVar118,auVar111);
        auVar150._4_4_ = fVar142;
        auVar150._0_4_ = fVar142;
        auVar150._8_4_ = fVar142;
        auVar150._12_4_ = fVar142;
        auVar150._16_4_ = fVar142;
        auVar150._20_4_ = fVar142;
        auVar150._24_4_ = fVar142;
        auVar150._28_4_ = fVar142;
        auVar111 = vcmpps_avx(auVar111,auVar150,1);
        auVar179 = vblendvps_avx(ZEXT1632(auVar143),auVar191,auVar111);
        auVar7 = vblendvps_avx(ZEXT1632(auVar129),_local_480,auVar111);
        auVar111 = vandps_avx(ZEXT1632(auVar18),auVar132);
        auVar118 = vandps_avx(ZEXT1632(auVar130),auVar132);
        auVar14 = vmaxps_avx(auVar111,auVar118);
        auVar111 = vandps_avx(ZEXT1632(auVar158),auVar132);
        auVar111 = vmaxps_avx(auVar14,auVar111);
        auVar112 = vcmpps_avx(auVar111,auVar150,1);
        auVar111 = vblendvps_avx(ZEXT1632(auVar18),auVar191,auVar112);
        auVar14 = vblendvps_avx(ZEXT1632(auVar130),_local_480,auVar112);
        auVar17 = vfmadd213ps_fma(auVar154,auVar159,ZEXT1632(auVar17));
        auVar18 = vfmadd213ps_fma(auVar179,auVar179,ZEXT832(0) << 0x20);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar7,auVar7);
        auVar154 = vrsqrtps_avx(ZEXT1632(auVar18));
        fVar141 = auVar154._0_4_;
        fVar120 = auVar154._4_4_;
        fVar121 = auVar154._8_4_;
        fVar122 = auVar154._12_4_;
        fVar123 = auVar154._16_4_;
        fVar124 = auVar154._20_4_;
        fVar125 = auVar154._24_4_;
        auVar191._4_4_ = fVar120 * fVar120 * fVar120 * auVar18._4_4_ * -0.5;
        auVar191._0_4_ = fVar141 * fVar141 * fVar141 * auVar18._0_4_ * -0.5;
        auVar191._8_4_ = fVar121 * fVar121 * fVar121 * auVar18._8_4_ * -0.5;
        auVar191._12_4_ = fVar122 * fVar122 * fVar122 * auVar18._12_4_ * -0.5;
        auVar191._16_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar191._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
        auVar191._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
        auVar191._28_4_ = 0;
        auVar169._8_4_ = 0x3fc00000;
        auVar169._0_8_ = 0x3fc000003fc00000;
        auVar169._12_4_ = 0x3fc00000;
        auVar169._16_4_ = 0x3fc00000;
        auVar169._20_4_ = 0x3fc00000;
        auVar169._24_4_ = 0x3fc00000;
        auVar169._28_4_ = 0x3fc00000;
        auVar18 = vfmadd231ps_fma(auVar191,auVar169,auVar154);
        fVar141 = auVar18._0_4_;
        fVar120 = auVar18._4_4_;
        auVar29._4_4_ = auVar7._4_4_ * fVar120;
        auVar29._0_4_ = auVar7._0_4_ * fVar141;
        fVar121 = auVar18._8_4_;
        auVar29._8_4_ = auVar7._8_4_ * fVar121;
        fVar122 = auVar18._12_4_;
        auVar29._12_4_ = auVar7._12_4_ * fVar122;
        auVar29._16_4_ = auVar7._16_4_ * 0.0;
        auVar29._20_4_ = auVar7._20_4_ * 0.0;
        auVar29._24_4_ = auVar7._24_4_ * 0.0;
        auVar29._28_4_ = auVar154._28_4_;
        auVar30._4_4_ = -auVar179._4_4_ * fVar120;
        auVar30._0_4_ = -auVar179._0_4_ * fVar141;
        auVar30._8_4_ = -auVar179._8_4_ * fVar121;
        auVar30._12_4_ = -auVar179._12_4_ * fVar122;
        auVar30._16_4_ = -auVar179._16_4_ * 0.0;
        auVar30._20_4_ = -auVar179._20_4_ * 0.0;
        auVar30._24_4_ = -auVar179._24_4_ * 0.0;
        auVar30._28_4_ = auVar118._28_4_;
        auVar18 = vfmadd213ps_fma(auVar111,auVar111,ZEXT832(0) << 0x20);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar14,auVar14);
        auVar118 = vrsqrtps_avx(ZEXT1632(auVar18));
        auVar31._28_4_ = auVar112._28_4_;
        auVar31._0_28_ =
             ZEXT1628(CONCAT412(fVar122 * 0.0,
                                CONCAT48(fVar121 * 0.0,CONCAT44(fVar120 * 0.0,fVar141 * 0.0))));
        fVar141 = auVar118._0_4_;
        fVar120 = auVar118._4_4_;
        fVar121 = auVar118._8_4_;
        fVar122 = auVar118._12_4_;
        fVar123 = auVar118._16_4_;
        fVar124 = auVar118._20_4_;
        fVar125 = auVar118._24_4_;
        auVar32._4_4_ = fVar120 * fVar120 * fVar120 * auVar18._4_4_ * -0.5;
        auVar32._0_4_ = fVar141 * fVar141 * fVar141 * auVar18._0_4_ * -0.5;
        auVar32._8_4_ = fVar121 * fVar121 * fVar121 * auVar18._8_4_ * -0.5;
        auVar32._12_4_ = fVar122 * fVar122 * fVar122 * auVar18._12_4_ * -0.5;
        auVar32._16_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar32._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
        auVar32._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
        auVar32._28_4_ = 0;
        auVar18 = vfmadd231ps_fma(auVar32,auVar169,auVar118);
        fVar141 = auVar18._0_4_;
        fVar120 = auVar18._4_4_;
        auVar33._4_4_ = auVar14._4_4_ * fVar120;
        auVar33._0_4_ = auVar14._0_4_ * fVar141;
        fVar121 = auVar18._8_4_;
        auVar33._8_4_ = auVar14._8_4_ * fVar121;
        fVar122 = auVar18._12_4_;
        auVar33._12_4_ = auVar14._12_4_ * fVar122;
        auVar33._16_4_ = auVar14._16_4_ * 0.0;
        auVar33._20_4_ = auVar14._20_4_ * 0.0;
        auVar33._24_4_ = auVar14._24_4_ * 0.0;
        auVar33._28_4_ = 0;
        auVar34._4_4_ = -auVar111._4_4_ * fVar120;
        auVar34._0_4_ = -auVar111._0_4_ * fVar141;
        auVar34._8_4_ = -auVar111._8_4_ * fVar121;
        auVar34._12_4_ = -auVar111._12_4_ * fVar122;
        auVar34._16_4_ = -auVar111._16_4_ * 0.0;
        auVar34._20_4_ = -auVar111._20_4_ * 0.0;
        auVar34._24_4_ = -auVar111._24_4_ * 0.0;
        auVar34._28_4_ = auVar14._28_4_;
        auVar35._28_4_ = auVar118._28_4_;
        auVar35._0_28_ =
             ZEXT1628(CONCAT412(fVar122 * 0.0,
                                CONCAT48(fVar121 * 0.0,CONCAT44(fVar120 * 0.0,fVar141 * 0.0))));
        auVar18 = vfmadd213ps_fma(auVar29,ZEXT1632(auVar109),local_400);
        auVar111 = ZEXT1632(auVar109);
        auVar143 = vfmadd213ps_fma(auVar30,auVar111,_local_460);
        auVar129 = vfmadd213ps_fma(auVar31,auVar111,ZEXT1632(auVar17));
        auVar165 = vfnmadd213ps_fma(auVar29,auVar111,local_400);
        auVar107 = vfmadd213ps_fma(auVar33,ZEXT1632(auVar108),local_420);
        auVar106 = vfnmadd213ps_fma(auVar30,auVar111,_local_460);
        auVar111 = ZEXT1632(auVar108);
        auVar130 = vfmadd213ps_fma(auVar34,auVar111,local_440);
        auVar217 = ZEXT1632(auVar109);
        auVar171 = vfnmadd231ps_fma(ZEXT1632(auVar17),auVar217,auVar31);
        auVar109 = vfmadd213ps_fma(auVar35,auVar111,local_6c0);
        auVar128 = vfnmadd213ps_fma(auVar33,auVar111,local_420);
        auVar164 = vfnmadd213ps_fma(auVar34,auVar111,local_440);
        auVar172 = vfnmadd231ps_fma(local_6c0,ZEXT1632(auVar108),auVar35);
        auVar111 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar106));
        auVar118 = vsubps_avx(ZEXT1632(auVar109),ZEXT1632(auVar171));
        auVar36._4_4_ = auVar171._4_4_ * auVar111._4_4_;
        auVar36._0_4_ = auVar171._0_4_ * auVar111._0_4_;
        auVar36._8_4_ = auVar171._8_4_ * auVar111._8_4_;
        auVar36._12_4_ = auVar171._12_4_ * auVar111._12_4_;
        auVar36._16_4_ = auVar111._16_4_ * 0.0;
        auVar36._20_4_ = auVar111._20_4_ * 0.0;
        auVar36._24_4_ = auVar111._24_4_ * 0.0;
        auVar36._28_4_ = 0;
        auVar158 = vfmsub231ps_fma(auVar36,ZEXT1632(auVar106),auVar118);
        auVar37._4_4_ = auVar165._4_4_ * auVar118._4_4_;
        auVar37._0_4_ = auVar165._0_4_ * auVar118._0_4_;
        auVar37._8_4_ = auVar165._8_4_ * auVar118._8_4_;
        auVar37._12_4_ = auVar165._12_4_ * auVar118._12_4_;
        auVar37._16_4_ = auVar118._16_4_ * 0.0;
        auVar37._20_4_ = auVar118._20_4_ * 0.0;
        auVar37._24_4_ = auVar118._24_4_ * 0.0;
        auVar37._28_4_ = auVar118._28_4_;
        auVar191 = ZEXT1632(auVar165);
        auVar118 = vsubps_avx(ZEXT1632(auVar107),auVar191);
        auVar17 = vfmsub231ps_fma(auVar37,ZEXT1632(auVar171),auVar118);
        auVar38._4_4_ = auVar106._4_4_ * auVar118._4_4_;
        auVar38._0_4_ = auVar106._0_4_ * auVar118._0_4_;
        auVar38._8_4_ = auVar106._8_4_ * auVar118._8_4_;
        auVar38._12_4_ = auVar106._12_4_ * auVar118._12_4_;
        auVar38._16_4_ = auVar118._16_4_ * 0.0;
        auVar38._20_4_ = auVar118._20_4_ * 0.0;
        auVar38._24_4_ = auVar118._24_4_ * 0.0;
        auVar38._28_4_ = auVar118._28_4_;
        auVar165 = vfmsub231ps_fma(auVar38,auVar191,auVar111);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar165),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar158));
        auVar22 = vcmpps_avx(ZEXT1632(auVar17),ZEXT832(0) << 0x20,2);
        auVar111 = vblendvps_avx(ZEXT1632(auVar128),ZEXT1632(auVar18),auVar22);
        auVar118 = vblendvps_avx(ZEXT1632(auVar164),ZEXT1632(auVar143),auVar22);
        auVar179 = vblendvps_avx(ZEXT1632(auVar172),ZEXT1632(auVar129),auVar22);
        auVar154 = vblendvps_avx(auVar191,ZEXT1632(auVar107),auVar22);
        auVar7 = vblendvps_avx(ZEXT1632(auVar106),ZEXT1632(auVar130),auVar22);
        auVar14 = vblendvps_avx(ZEXT1632(auVar171),ZEXT1632(auVar109),auVar22);
        auVar191 = vblendvps_avx(ZEXT1632(auVar107),auVar191,auVar22);
        auVar112 = vblendvps_avx(ZEXT1632(auVar130),ZEXT1632(auVar106),auVar22);
        auVar17 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
        auVar119 = vblendvps_avx(ZEXT1632(auVar109),ZEXT1632(auVar171),auVar22);
        auVar195 = vsubps_avx(auVar191,auVar111);
        auVar112 = vsubps_avx(auVar112,auVar118);
        auVar20 = vsubps_avx(auVar119,auVar179);
        auVar21 = vsubps_avx(auVar111,auVar154);
        auVar131 = vsubps_avx(auVar118,auVar7);
        auVar19 = vsubps_avx(auVar179,auVar14);
        auVar39._4_4_ = auVar20._4_4_ * auVar111._4_4_;
        auVar39._0_4_ = auVar20._0_4_ * auVar111._0_4_;
        auVar39._8_4_ = auVar20._8_4_ * auVar111._8_4_;
        auVar39._12_4_ = auVar20._12_4_ * auVar111._12_4_;
        auVar39._16_4_ = auVar20._16_4_ * auVar111._16_4_;
        auVar39._20_4_ = auVar20._20_4_ * auVar111._20_4_;
        auVar39._24_4_ = auVar20._24_4_ * auVar111._24_4_;
        auVar39._28_4_ = auVar119._28_4_;
        auVar18 = vfmsub231ps_fma(auVar39,auVar179,auVar195);
        auVar40._4_4_ = auVar195._4_4_ * auVar118._4_4_;
        auVar40._0_4_ = auVar195._0_4_ * auVar118._0_4_;
        auVar40._8_4_ = auVar195._8_4_ * auVar118._8_4_;
        auVar40._12_4_ = auVar195._12_4_ * auVar118._12_4_;
        auVar40._16_4_ = auVar195._16_4_ * auVar118._16_4_;
        auVar40._20_4_ = auVar195._20_4_ * auVar118._20_4_;
        auVar40._24_4_ = auVar195._24_4_ * auVar118._24_4_;
        auVar40._28_4_ = auVar191._28_4_;
        auVar109 = vfmsub231ps_fma(auVar40,auVar111,auVar112);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar109),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
        auVar115._0_4_ = auVar112._0_4_ * auVar179._0_4_;
        auVar115._4_4_ = auVar112._4_4_ * auVar179._4_4_;
        auVar115._8_4_ = auVar112._8_4_ * auVar179._8_4_;
        auVar115._12_4_ = auVar112._12_4_ * auVar179._12_4_;
        auVar115._16_4_ = auVar112._16_4_ * auVar179._16_4_;
        auVar115._20_4_ = auVar112._20_4_ * auVar179._20_4_;
        auVar115._24_4_ = auVar112._24_4_ * auVar179._24_4_;
        auVar115._28_4_ = 0;
        auVar109 = vfmsub231ps_fma(auVar115,auVar118,auVar20);
        auVar109 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar109));
        auVar116._0_4_ = auVar19._0_4_ * auVar154._0_4_;
        auVar116._4_4_ = auVar19._4_4_ * auVar154._4_4_;
        auVar116._8_4_ = auVar19._8_4_ * auVar154._8_4_;
        auVar116._12_4_ = auVar19._12_4_ * auVar154._12_4_;
        auVar116._16_4_ = auVar19._16_4_ * auVar154._16_4_;
        auVar116._20_4_ = auVar19._20_4_ * auVar154._20_4_;
        auVar116._24_4_ = auVar19._24_4_ * auVar154._24_4_;
        auVar116._28_4_ = 0;
        auVar18 = vfmsub231ps_fma(auVar116,auVar21,auVar14);
        auVar41._4_4_ = auVar131._4_4_ * auVar14._4_4_;
        auVar41._0_4_ = auVar131._0_4_ * auVar14._0_4_;
        auVar41._8_4_ = auVar131._8_4_ * auVar14._8_4_;
        auVar41._12_4_ = auVar131._12_4_ * auVar14._12_4_;
        auVar41._16_4_ = auVar131._16_4_ * auVar14._16_4_;
        auVar41._20_4_ = auVar131._20_4_ * auVar14._20_4_;
        auVar41._24_4_ = auVar131._24_4_ * auVar14._24_4_;
        auVar41._28_4_ = auVar14._28_4_;
        auVar143 = vfmsub231ps_fma(auVar41,auVar7,auVar19);
        auVar42._4_4_ = auVar21._4_4_ * auVar7._4_4_;
        auVar42._0_4_ = auVar21._0_4_ * auVar7._0_4_;
        auVar42._8_4_ = auVar21._8_4_ * auVar7._8_4_;
        auVar42._12_4_ = auVar21._12_4_ * auVar7._12_4_;
        auVar42._16_4_ = auVar21._16_4_ * auVar7._16_4_;
        auVar42._20_4_ = auVar21._20_4_ * auVar7._20_4_;
        auVar42._24_4_ = auVar21._24_4_ * auVar7._24_4_;
        auVar42._28_4_ = auVar7._28_4_;
        auVar129 = vfmsub231ps_fma(auVar42,auVar131,auVar154);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar129),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar143));
        auVar154 = vmaxps_avx(ZEXT1632(auVar109),ZEXT1632(auVar143));
        auVar154 = vcmpps_avx(auVar154,ZEXT832(0) << 0x20,2);
        auVar18 = vpackssdw_avx(auVar154._0_16_,auVar154._16_16_);
        auVar17 = vpand_avx(auVar17,auVar18);
        auVar154 = vpmovsxwd_avx2(auVar17);
        if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar154 >> 0x7f,0) == '\0') &&
              (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar154 >> 0xbf,0) == '\0') &&
            (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar154[0x1f]) {
          auVar199 = ZEXT864(0) << 0x20;
LAB_015a3203:
          auVar184 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar207 = ZEXT3264(auVar137);
        }
        else {
          auVar43._4_4_ = auVar112._4_4_ * auVar19._4_4_;
          auVar43._0_4_ = auVar112._0_4_ * auVar19._0_4_;
          auVar43._8_4_ = auVar112._8_4_ * auVar19._8_4_;
          auVar43._12_4_ = auVar112._12_4_ * auVar19._12_4_;
          auVar43._16_4_ = auVar112._16_4_ * auVar19._16_4_;
          auVar43._20_4_ = auVar112._20_4_ * auVar19._20_4_;
          auVar43._24_4_ = auVar112._24_4_ * auVar19._24_4_;
          auVar43._28_4_ = auVar154._28_4_;
          auVar130 = vfmsub231ps_fma(auVar43,auVar131,auVar20);
          auVar133._0_4_ = auVar21._0_4_ * auVar20._0_4_;
          auVar133._4_4_ = auVar21._4_4_ * auVar20._4_4_;
          auVar133._8_4_ = auVar21._8_4_ * auVar20._8_4_;
          auVar133._12_4_ = auVar21._12_4_ * auVar20._12_4_;
          auVar133._16_4_ = auVar21._16_4_ * auVar20._16_4_;
          auVar133._20_4_ = auVar21._20_4_ * auVar20._20_4_;
          auVar133._24_4_ = auVar21._24_4_ * auVar20._24_4_;
          auVar133._28_4_ = 0;
          auVar107 = vfmsub231ps_fma(auVar133,auVar195,auVar19);
          auVar44._4_4_ = auVar195._4_4_ * auVar131._4_4_;
          auVar44._0_4_ = auVar195._0_4_ * auVar131._0_4_;
          auVar44._8_4_ = auVar195._8_4_ * auVar131._8_4_;
          auVar44._12_4_ = auVar195._12_4_ * auVar131._12_4_;
          auVar44._16_4_ = auVar195._16_4_ * auVar131._16_4_;
          auVar44._20_4_ = auVar195._20_4_ * auVar131._20_4_;
          auVar44._24_4_ = auVar195._24_4_ * auVar131._24_4_;
          auVar44._28_4_ = auVar195._28_4_;
          auVar158 = vfmsub231ps_fma(auVar44,auVar21,auVar112);
          auVar18 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar107),ZEXT1632(auVar158));
          auVar129 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT1632(auVar130),_DAT_01faff00);
          auVar154 = vrcpps_avx(ZEXT1632(auVar129));
          auVar206._8_4_ = 0x3f800000;
          auVar206._0_8_ = 0x3f8000003f800000;
          auVar206._12_4_ = 0x3f800000;
          auVar206._16_4_ = 0x3f800000;
          auVar206._20_4_ = 0x3f800000;
          auVar206._24_4_ = 0x3f800000;
          auVar206._28_4_ = 0x3f800000;
          auVar18 = vfnmadd213ps_fma(auVar154,ZEXT1632(auVar129),auVar206);
          auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar154,auVar154);
          auVar45._4_4_ = auVar158._4_4_ * auVar179._4_4_;
          auVar45._0_4_ = auVar158._0_4_ * auVar179._0_4_;
          auVar45._8_4_ = auVar158._8_4_ * auVar179._8_4_;
          auVar45._12_4_ = auVar158._12_4_ * auVar179._12_4_;
          auVar45._16_4_ = auVar179._16_4_ * 0.0;
          auVar45._20_4_ = auVar179._20_4_ * 0.0;
          auVar45._24_4_ = auVar179._24_4_ * 0.0;
          auVar45._28_4_ = auVar179._28_4_;
          auVar107 = vfmadd231ps_fma(auVar45,auVar118,ZEXT1632(auVar107));
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar130),auVar111);
          fVar141 = auVar18._0_4_;
          fVar120 = auVar18._4_4_;
          fVar121 = auVar18._8_4_;
          fVar122 = auVar18._12_4_;
          auVar46._28_4_ = auVar118._28_4_;
          auVar46._0_28_ =
               ZEXT1628(CONCAT412(fVar122 * auVar107._12_4_,
                                  CONCAT48(fVar121 * auVar107._8_4_,
                                           CONCAT44(fVar120 * auVar107._4_4_,
                                                    fVar141 * auVar107._0_4_))));
          auVar117._4_4_ = uVar97;
          auVar117._0_4_ = uVar97;
          auVar117._8_4_ = uVar97;
          auVar117._12_4_ = uVar97;
          auVar117._16_4_ = uVar97;
          auVar117._20_4_ = uVar97;
          auVar117._24_4_ = uVar97;
          auVar117._28_4_ = uVar97;
          uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar134._4_4_ = uVar104;
          auVar134._0_4_ = uVar104;
          auVar134._8_4_ = uVar104;
          auVar134._12_4_ = uVar104;
          auVar134._16_4_ = uVar104;
          auVar134._20_4_ = uVar104;
          auVar134._24_4_ = uVar104;
          auVar134._28_4_ = uVar104;
          auVar111 = vcmpps_avx(auVar117,auVar46,2);
          auVar118 = vcmpps_avx(auVar46,auVar134,2);
          auVar111 = vandps_avx(auVar118,auVar111);
          auVar18 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
          auVar17 = vpand_avx(auVar17,auVar18);
          auVar111 = vpmovsxwd_avx2(auVar17);
          auVar199 = ZEXT864(0) << 0x20;
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar111 >> 0x7f,0) == '\0') &&
                (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar111 >> 0xbf,0) == '\0') &&
              (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar111[0x1f]) goto LAB_015a3203;
          auVar111 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar129),4);
          auVar18 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
          auVar17 = vpand_avx(auVar17,auVar18);
          auVar111 = vpmovsxwd_avx2(auVar17);
          auVar184 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar207 = ZEXT3264(auVar137);
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar111 >> 0x7f,0) != '\0') ||
                (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar111 >> 0xbf,0) != '\0') ||
              (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar111[0x1f] < '\0') {
            auVar118 = ZEXT1632(CONCAT412(fVar122 * auVar109._12_4_,
                                          CONCAT48(fVar121 * auVar109._8_4_,
                                                   CONCAT44(fVar120 * auVar109._4_4_,
                                                            fVar141 * auVar109._0_4_))));
            auVar47._28_4_ = local_560._28_4_;
            auVar47._0_28_ =
                 ZEXT1628(CONCAT412(fVar122 * auVar143._12_4_,
                                    CONCAT48(fVar121 * auVar143._8_4_,
                                             CONCAT44(fVar120 * auVar143._4_4_,
                                                      fVar141 * auVar143._0_4_))));
            auVar170._8_4_ = 0x3f800000;
            auVar170._0_8_ = 0x3f8000003f800000;
            auVar170._12_4_ = 0x3f800000;
            auVar170._16_4_ = 0x3f800000;
            auVar170._20_4_ = 0x3f800000;
            auVar170._24_4_ = 0x3f800000;
            auVar170._28_4_ = 0x3f800000;
            auVar137 = vsubps_avx(auVar170,auVar118);
            auVar137 = vblendvps_avx(auVar137,auVar118,auVar22);
            auVar207 = ZEXT3264(auVar137);
            auVar137 = vsubps_avx(auVar170,auVar47);
            local_4e0 = vblendvps_avx(auVar137,auVar47,auVar22);
            auVar184 = ZEXT3264(auVar111);
            local_560 = auVar46;
          }
        }
        auVar139 = ZEXT3264(auVar159);
        auVar213 = ZEXT3264(_local_700);
        auVar111 = auVar184._0_32_;
        if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar111 >> 0x7f,0) == '\0') &&
              (auVar184 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar111 >> 0xbf,0) == '\0') &&
            (auVar184 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar184[0x1f]) {
          uVar98 = 0;
          auVar188 = ZEXT3264(CONCAT428(fVar208,CONCAT424(fVar208,CONCAT420(fVar208,CONCAT416(
                                                  fVar208,CONCAT412(fVar208,CONCAT48(fVar208,
                                                  CONCAT44(fVar208,fVar208))))))));
          auVar184 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar157,CONCAT420(fVar163,CONCAT416(
                                                  fVar157,CONCAT412(fVar163,CONCAT48(fVar157,uVar105
                                                                                    )))))));
        }
        else {
          auVar137 = vsubps_avx(ZEXT1632(auVar108),auVar217);
          auVar179 = auVar207._0_32_;
          auVar17 = vfmadd213ps_fma(auVar137,auVar179,auVar217);
          fVar141 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar137._4_4_ = (auVar17._4_4_ + auVar17._4_4_) * fVar141;
          auVar137._0_4_ = (auVar17._0_4_ + auVar17._0_4_) * fVar141;
          auVar137._8_4_ = (auVar17._8_4_ + auVar17._8_4_) * fVar141;
          auVar137._12_4_ = (auVar17._12_4_ + auVar17._12_4_) * fVar141;
          auVar137._16_4_ = fVar141 * 0.0;
          auVar137._20_4_ = fVar141 * 0.0;
          auVar137._24_4_ = fVar141 * 0.0;
          auVar137._28_4_ = 0;
          auVar137 = vcmpps_avx(local_560,auVar137,6);
          auVar118 = auVar111 & auVar137;
          auVar188 = ZEXT3264(CONCAT428(fVar208,CONCAT424(fVar208,CONCAT420(fVar208,CONCAT416(
                                                  fVar208,CONCAT412(fVar208,CONCAT48(fVar208,
                                                  CONCAT44(fVar208,fVar208))))))));
          auVar184 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar157,CONCAT420(fVar163,CONCAT416(
                                                  fVar157,CONCAT412(fVar163,CONCAT48(fVar157,uVar105
                                                                                    )))))));
          if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar118 >> 0x7f,0) == '\0') &&
                (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar118 >> 0xbf,0) == '\0') &&
              (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar118[0x1f]) {
            uVar98 = 0;
          }
          else {
            auVar135._8_4_ = 0xbf800000;
            auVar135._0_8_ = 0xbf800000bf800000;
            auVar135._12_4_ = 0xbf800000;
            auVar135._16_4_ = 0xbf800000;
            auVar135._20_4_ = 0xbf800000;
            auVar135._24_4_ = 0xbf800000;
            auVar135._28_4_ = 0xbf800000;
            auVar151._8_4_ = 0x40000000;
            auVar151._0_8_ = 0x4000000040000000;
            auVar151._12_4_ = 0x40000000;
            auVar151._16_4_ = 0x40000000;
            auVar151._20_4_ = 0x40000000;
            auVar151._24_4_ = 0x40000000;
            auVar151._28_4_ = 0x40000000;
            auVar17 = vfmadd213ps_fma(local_4e0,auVar151,auVar135);
            local_380 = ZEXT1632(auVar17);
            local_340 = 0;
            local_320 = local_740;
            uStack_318 = uStack_738;
            local_310 = local_750;
            uStack_308 = uStack_748;
            local_4e0 = local_380;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_015a16d0;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar98 = CONCAT71((int7)((ulong)context->args >> 8),1),
               pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar111 = vandps_avx(auVar137,auVar111);
              fVar141 = 1.0 / auVar113._0_4_;
              local_2c0[0] = fVar141 * (auVar207._0_4_ + 0.0);
              local_2c0[1] = fVar141 * (auVar207._4_4_ + 1.0);
              local_2c0[2] = fVar141 * (auVar207._8_4_ + 2.0);
              local_2c0[3] = fVar141 * (auVar207._12_4_ + 3.0);
              fStack_2b0 = fVar141 * (auVar207._16_4_ + 4.0);
              fStack_2ac = fVar141 * (auVar207._20_4_ + 5.0);
              fStack_2a8 = fVar141 * (auVar207._24_4_ + 6.0);
              fStack_2a4 = auVar207._28_4_ + 7.0;
              local_4e0._0_8_ = auVar17._0_8_;
              local_4e0._8_8_ = auVar17._8_8_;
              local_2a0 = local_4e0._0_8_;
              uStack_298 = local_4e0._8_8_;
              uStack_290 = 0;
              uStack_288 = 0;
              local_280 = local_560;
              uVar97 = vmovmskps_avx(auVar111);
              if (uVar97 == 0) {
                uVar98 = 0;
              }
              else {
                uVar99 = 0;
                local_920._0_8_ = ZEXT48(uVar97 & 0xff);
                for (uVar98 = local_920._0_8_; (uVar98 & 1) == 0;
                    uVar98 = uVar98 >> 1 | 0x8000000000000000) {
                  uVar99 = uVar99 + 1;
                }
                local_6c0._4_4_ = uVar100;
                local_6c0._0_4_ = uVar100;
                local_6c0._8_4_ = uVar100;
                local_6c0._12_4_ = uVar100;
                local_6c0._16_4_ = uVar100;
                local_6c0._20_4_ = uVar100;
                local_6c0._24_4_ = uVar100;
                local_6c0._28_4_ = uVar100;
                local_900 = CONCAT44(local_540,local_540);
                uStack_8f8._0_4_ = local_540;
                uStack_8f8._4_4_ = local_540;
                uStack_8f0._0_4_ = local_540;
                uStack_8f0._4_4_ = local_540;
                auVar94 = _local_900;
                uStack_8e8._0_4_ = local_540;
                uStack_8e8._4_4_ = local_540;
                auVar111 = _local_900;
                local_640 = ZEXT1632(CONCAT124(auVar108._4_12_,*(undefined4 *)(ray + k * 4 + 0x100))
                                    );
                local_6a0 = auVar159;
                local_3a0 = auVar179;
                local_360 = local_560;
                local_33c = iVar96;
                local_330 = uVar89;
                uStack_328 = uVar90;
                do {
                  local_200 = local_2c0[uVar99];
                  local_1e0 = *(undefined4 *)((long)&local_2a0 + uVar99 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_280 + uVar99 * 4);
                  fVar121 = 1.0 - local_200;
                  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar121 * fVar121)),
                                            ZEXT416((uint)(local_200 * fVar121)),ZEXT416(0xc0000000)
                                           );
                  auVar17 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar121)),
                                            ZEXT416((uint)(local_200 * local_200)),
                                            ZEXT416(0x40000000));
                  fVar141 = auVar17._0_4_ * 3.0;
                  fVar120 = local_200 * local_200 * 3.0;
                  auVar174._0_4_ = fVar120 * (float)local_5f0._0_4_;
                  auVar174._4_4_ = fVar120 * (float)local_5f0._4_4_;
                  auVar174._8_4_ = fVar120 * fStack_5e8;
                  auVar174._12_4_ = fVar120 * fStack_5e4;
                  auVar144._4_4_ = fVar141;
                  auVar144._0_4_ = fVar141;
                  auVar144._8_4_ = fVar141;
                  auVar144._12_4_ = fVar141;
                  auVar17 = vfmadd132ps_fma(auVar144,auVar174,auVar16);
                  fVar141 = auVar18._0_4_ * 3.0;
                  auVar167._4_4_ = fVar141;
                  auVar167._0_4_ = fVar141;
                  auVar167._8_4_ = fVar141;
                  auVar167._12_4_ = fVar141;
                  auVar17 = vfmadd132ps_fma(auVar167,auVar17,auVar15);
                  fVar141 = fVar121 * fVar121 * -3.0;
                  local_730.context = context->user;
                  auVar145._4_4_ = fVar141;
                  auVar145._0_4_ = fVar141;
                  auVar145._8_4_ = fVar141;
                  auVar145._12_4_ = fVar141;
                  auVar18 = vfmadd132ps_fma(auVar145,auVar17,auVar12);
                  local_260 = auVar18._0_4_;
                  uStack_25c = local_260;
                  uStack_258 = local_260;
                  uStack_254 = local_260;
                  uStack_250 = local_260;
                  uStack_24c = local_260;
                  uStack_248 = local_260;
                  uStack_244 = local_260;
                  auVar17 = vmovshdup_avx(auVar18);
                  local_240 = auVar17._0_8_;
                  uStack_238 = local_240;
                  uStack_230 = local_240;
                  uStack_228 = local_240;
                  auVar17 = vshufps_avx(auVar18,auVar18,0xaa);
                  auVar146._0_8_ = auVar17._0_8_;
                  auVar146._8_8_ = auVar146._0_8_;
                  auVar152._16_8_ = auVar146._0_8_;
                  auVar152._0_16_ = auVar146;
                  auVar152._24_8_ = auVar146._0_8_;
                  local_220 = auVar152;
                  fStack_1fc = local_200;
                  fStack_1f8 = local_200;
                  fStack_1f4 = local_200;
                  fStack_1f0 = local_200;
                  fStack_1ec = local_200;
                  fStack_1e8 = local_200;
                  fStack_1e4 = local_200;
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  uStack_8f0 = auVar94._16_8_;
                  uStack_8e8 = auVar111._24_8_;
                  local_1c0 = local_900;
                  uStack_1b8 = uStack_8f8;
                  uStack_1b0 = uStack_8f0;
                  uStack_1a8 = uStack_8e8;
                  local_1a0 = local_6c0;
                  vpcmpeqd_avx2(local_6c0,local_6c0);
                  local_180 = (local_730.context)->instID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_160 = (local_730.context)->instPrimID[0];
                  uStack_15c = local_160;
                  uStack_158 = local_160;
                  uStack_154 = local_160;
                  uStack_150 = local_160;
                  uStack_14c = local_160;
                  uStack_148 = local_160;
                  uStack_144 = local_160;
                  local_620 = local_3c0;
                  local_730.valid = (int *)local_620;
                  local_730.geometryUserPtr = *(void **)(CONCAT44(uStack_5bc,local_5c0) + 0x18);
                  local_730.hit = (RTCHitN *)&local_260;
                  local_730.N = 8;
                  pcVar10 = *(code **)(CONCAT44(uStack_5bc,local_5c0) + 0x48);
                  local_730.ray = (RTCRayN *)ray;
                  if (pcVar10 != (code *)0x0) {
                    auVar152 = ZEXT1632(auVar146);
                    (*pcVar10)(&local_730);
                    auVar213 = ZEXT3264(_local_700);
                    auVar139 = ZEXT3264(local_6a0);
                    auVar188 = ZEXT3264(CONCAT428(fVar208,CONCAT424(fVar208,CONCAT420(fVar208,
                                                  CONCAT416(fVar208,CONCAT412(fVar208,CONCAT48(
                                                  fVar208,CONCAT44(fVar208,fVar208))))))));
                    auVar207 = ZEXT3264(auVar179);
                    auVar199 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar118 = vpcmpeqd_avx2(auVar199._0_32_,local_620);
                  auVar154 = vpcmpeqd_avx2(auVar152,auVar152);
                  auVar137 = auVar154 & ~auVar118;
                  if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar137 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar137 >> 0x7f,0) == '\0') &&
                        (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar137 >> 0xbf,0) == '\0') &&
                      (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar137[0x1f]) {
                    auVar118 = auVar118 ^ auVar154;
                  }
                  else {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_5bc,local_5c0) + 0x3e) & 0x40) != 0)))) {
                      (*p_Var11)(&local_730);
                      auVar213 = ZEXT3264(_local_700);
                      auVar139 = ZEXT3264(local_6a0);
                      auVar188 = ZEXT3264(CONCAT428(fVar208,CONCAT424(fVar208,CONCAT420(fVar208,
                                                  CONCAT416(fVar208,CONCAT412(fVar208,CONCAT48(
                                                  fVar208,CONCAT44(fVar208,fVar208))))))));
                      auVar207 = ZEXT3264(auVar179);
                      auVar199 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar137 = vpcmpeqd_avx2(auVar199._0_32_,local_620);
                    auVar118 = vpcmpeqd_avx2(local_620,local_620);
                    auVar118 = auVar137 ^ auVar118;
                    auVar153._8_4_ = 0xff800000;
                    auVar153._0_8_ = 0xff800000ff800000;
                    auVar153._12_4_ = 0xff800000;
                    auVar153._16_4_ = 0xff800000;
                    auVar153._20_4_ = 0xff800000;
                    auVar153._24_4_ = 0xff800000;
                    auVar153._28_4_ = 0xff800000;
                    auVar137 = vblendvps_avx(auVar153,*(undefined1 (*) [32])(local_730.ray + 0x100),
                                             auVar137);
                    *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar137;
                  }
                  auVar159 = auVar139._0_32_;
                  auVar184 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar157,CONCAT420(fVar163,
                                                  CONCAT416(fVar157,CONCAT412(fVar163,CONCAT48(
                                                  fVar157,uVar105)))))));
                  if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar118 >> 0x7f,0) != '\0') ||
                        (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar118 >> 0xbf,0) != '\0') ||
                      (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar118[0x1f] < '\0') {
                    uVar98 = CONCAT71((int7)(uVar99 >> 8),1);
                    break;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x100) = local_640._0_4_;
                  uVar102 = uVar99 & 0x3f;
                  uVar98 = 0;
                  uVar99 = 0;
                  local_920._0_8_ = local_920._0_8_ ^ 1L << uVar102;
                  for (uVar102 = local_920._0_8_; (uVar102 & 1) == 0;
                      uVar102 = uVar102 >> 1 | 0x8000000000000000) {
                    uVar99 = uVar99 + 1;
                  }
                } while (local_920._0_8_ != 0);
              }
            }
          }
        }
      }
      uVar97 = (uint)uVar98;
      auVar139 = ZEXT3264(local_680);
      auVar199 = ZEXT3264(local_6e0);
      if (8 < iVar96) {
        local_4a0._4_4_ = iVar96;
        local_4a0._0_4_ = iVar96;
        local_4a0._8_4_ = iVar96;
        local_4a0._12_4_ = iVar96;
        local_4a0._16_4_ = iVar96;
        local_4a0._20_4_ = iVar96;
        local_4a0._24_4_ = iVar96;
        local_4a0._28_4_ = iVar96;
        local_4c0._4_4_ = fVar142;
        local_4c0._0_4_ = fVar142;
        fStack_4b8 = fVar142;
        fStack_4b4 = fVar142;
        fStack_4b0 = fVar142;
        fStack_4ac = fVar142;
        fStack_4a8 = fVar142;
        fStack_4a4 = fVar142;
        local_5c0 = local_660._0_4_;
        uStack_5bc = local_660._0_4_;
        uStack_5b8 = local_660._0_4_;
        uStack_5b4 = local_660._0_4_;
        uStack_5b0 = local_660._0_4_;
        uStack_5ac = local_660._0_4_;
        uStack_5a8 = local_660._0_4_;
        uStack_5a4 = local_660._0_4_;
        local_140 = 1.0 / (float)local_520._0_4_;
        fStack_13c = local_140;
        fStack_138 = local_140;
        fStack_134 = local_140;
        fStack_130 = local_140;
        fStack_12c = local_140;
        fStack_128 = local_140;
        fStack_124 = local_140;
        local_120 = uVar100;
        uStack_11c = uVar100;
        uStack_118 = uVar100;
        uStack_114 = uVar100;
        uStack_110 = uVar100;
        uStack_10c = uVar100;
        uStack_108 = uVar100;
        uStack_104 = uVar100;
        uStack_53c = local_540;
        uStack_538 = local_540;
        uStack_534 = local_540;
        uStack_530 = local_540;
        uStack_52c = local_540;
        uStack_528 = local_540;
        uStack_524 = local_540;
        lVar103 = 8;
        auVar111 = auVar207._0_32_;
        _local_700 = auVar213._0_32_;
        local_6a0 = auVar159;
        do {
          local_6c0._0_4_ = (int)uVar98;
          auVar195 = auVar199._0_32_;
          local_680 = auVar139._0_32_;
          auVar137 = *(undefined1 (*) [32])(bezier_basis0 + lVar103 * 4 + lVar23);
          auVar118 = *(undefined1 (*) [32])(lVar23 + 0x21aa768 + lVar103 * 4);
          auVar179 = *(undefined1 (*) [32])(lVar23 + 0x21aabec + lVar103 * 4);
          pauVar2 = (undefined1 (*) [32])(lVar23 + 0x21ab070 + lVar103 * 4);
          fVar125 = *(float *)*pauVar2;
          fVar78 = *(float *)(*pauVar2 + 4);
          fVar79 = *(float *)(*pauVar2 + 8);
          fVar80 = *(float *)(*pauVar2 + 0xc);
          fVar81 = *(float *)(*pauVar2 + 0x10);
          fVar82 = *(float *)(*pauVar2 + 0x14);
          fVar83 = *(float *)(*pauVar2 + 0x18);
          auVar92 = *(undefined1 (*) [28])*pauVar2;
          auVar212._0_4_ = fVar125 * auVar188._0_4_;
          auVar212._4_4_ = fVar78 * auVar188._4_4_;
          auVar212._8_4_ = fVar79 * auVar188._8_4_;
          auVar212._12_4_ = fVar80 * auVar188._12_4_;
          auVar212._16_4_ = fVar81 * auVar188._16_4_;
          auVar212._20_4_ = fVar82 * auVar188._20_4_;
          auVar212._28_36_ = auVar213._28_36_;
          auVar212._24_4_ = fVar83 * auVar188._24_4_;
          auVar199._0_4_ = fVar125 * auVar184._0_4_;
          auVar199._4_4_ = fVar78 * auVar184._4_4_;
          auVar199._8_4_ = fVar79 * auVar184._8_4_;
          auVar199._12_4_ = fVar80 * auVar184._12_4_;
          auVar199._16_4_ = fVar81 * auVar184._16_4_;
          auVar199._20_4_ = fVar82 * auVar184._20_4_;
          auVar199._28_36_ = auVar139._28_36_;
          auVar199._24_4_ = fVar83 * auVar184._24_4_;
          auVar12 = vfmadd231ps_fma(auVar212._0_32_,auVar179,auVar149);
          auVar17 = vfmadd231ps_fma(auVar199._0_32_,auVar179,auVar205);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar118,auVar201);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar118,auVar219);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar137,auVar216);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar137,local_5a0);
          auVar154 = *(undefined1 (*) [32])(bezier_basis1 + lVar103 * 4 + lVar23);
          auVar7 = *(undefined1 (*) [32])(lVar23 + 0x21acb88 + lVar103 * 4);
          auVar14 = *(undefined1 (*) [32])(lVar23 + 0x21ad00c + lVar103 * 4);
          pauVar3 = (undefined1 (*) [32])(lVar23 + 0x21ad490 + lVar103 * 4);
          fVar126 = *(float *)*pauVar3;
          fVar140 = *(float *)(*pauVar3 + 4);
          fVar84 = *(float *)(*pauVar3 + 8);
          fVar85 = *(float *)(*pauVar3 + 0xc);
          fVar86 = *(float *)(*pauVar3 + 0x10);
          fVar87 = *(float *)(*pauVar3 + 0x14);
          fVar88 = *(float *)(*pauVar3 + 0x18);
          auVar93 = *(undefined1 (*) [28])*pauVar3;
          auVar213._0_4_ = fVar126 * auVar188._0_4_;
          auVar213._4_4_ = fVar140 * auVar188._4_4_;
          auVar213._8_4_ = fVar84 * auVar188._8_4_;
          auVar213._12_4_ = fVar85 * auVar188._12_4_;
          auVar213._16_4_ = fVar86 * auVar188._16_4_;
          auVar213._20_4_ = fVar87 * auVar188._20_4_;
          auVar213._28_36_ = auVar188._28_36_;
          auVar213._24_4_ = fVar88 * auVar188._24_4_;
          auVar48._4_4_ = fVar140 * auVar184._4_4_;
          auVar48._0_4_ = fVar126 * auVar184._0_4_;
          auVar48._8_4_ = fVar84 * auVar184._8_4_;
          auVar48._12_4_ = fVar85 * auVar184._12_4_;
          auVar48._16_4_ = fVar86 * auVar184._16_4_;
          auVar48._20_4_ = fVar87 * auVar184._20_4_;
          auVar48._24_4_ = fVar88 * auVar184._24_4_;
          auVar48._28_4_ = auVar137._28_4_;
          auVar18 = vfmadd231ps_fma(auVar213._0_32_,auVar14,auVar149);
          auVar109 = vfmadd231ps_fma(auVar48,auVar14,auVar205);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar7,auVar201);
          auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar7,auVar219);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar154,auVar216);
          auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar154,local_5a0);
          local_440 = ZEXT1632(auVar18);
          local_400 = ZEXT1632(auVar12);
          auVar112 = vsubps_avx(local_440,local_400);
          local_640 = ZEXT1632(auVar109);
          local_660 = ZEXT1632(auVar17);
          local_420 = vsubps_avx(local_640,local_660);
          auVar49._4_4_ = auVar112._4_4_ * auVar17._4_4_;
          auVar49._0_4_ = auVar112._0_4_ * auVar17._0_4_;
          auVar49._8_4_ = auVar112._8_4_ * auVar17._8_4_;
          auVar49._12_4_ = auVar112._12_4_ * auVar17._12_4_;
          auVar49._16_4_ = auVar112._16_4_ * 0.0;
          auVar49._20_4_ = auVar112._20_4_ * 0.0;
          auVar49._24_4_ = auVar112._24_4_ * 0.0;
          auVar49._28_4_ = auVar14._28_4_;
          fVar142 = local_420._0_4_;
          auVar136._0_4_ = auVar12._0_4_ * fVar142;
          fVar141 = local_420._4_4_;
          auVar136._4_4_ = auVar12._4_4_ * fVar141;
          fVar120 = local_420._8_4_;
          auVar136._8_4_ = auVar12._8_4_ * fVar120;
          fVar121 = local_420._12_4_;
          auVar136._12_4_ = auVar12._12_4_ * fVar121;
          fVar122 = local_420._16_4_;
          auVar136._16_4_ = fVar122 * 0.0;
          fVar123 = local_420._20_4_;
          auVar136._20_4_ = fVar123 * 0.0;
          fVar124 = local_420._24_4_;
          auVar136._24_4_ = fVar124 * 0.0;
          auVar136._28_4_ = 0;
          auVar213 = ZEXT3264(auVar179);
          auVar119 = vsubps_avx(auVar49,auVar136);
          auVar139._0_4_ = fVar125 * (float)local_e0;
          auVar139._4_4_ = fVar78 * local_e0._4_4_;
          auVar139._8_4_ = fVar79 * (float)uStack_d8;
          auVar139._12_4_ = fVar80 * uStack_d8._4_4_;
          auVar139._16_4_ = fVar81 * (float)uStack_d0;
          auVar139._20_4_ = fVar82 * uStack_d0._4_4_;
          auVar139._28_36_ = auVar184._28_36_;
          auVar139._24_4_ = fVar83 * (float)uStack_c8;
          auVar12 = vfmadd231ps_fma(auVar139._0_32_,auVar179,local_c0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar118,local_a0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_80,auVar137);
          auVar50._4_4_ = fVar140 * local_e0._4_4_;
          auVar50._0_4_ = fVar126 * (float)local_e0;
          auVar50._8_4_ = fVar84 * (float)uStack_d8;
          auVar50._12_4_ = fVar85 * uStack_d8._4_4_;
          auVar50._16_4_ = fVar86 * (float)uStack_d0;
          auVar50._20_4_ = fVar87 * uStack_d0._4_4_;
          auVar50._24_4_ = fVar88 * (float)uStack_c8;
          auVar50._28_4_ = uStack_c8._4_4_;
          auVar18 = vfmadd231ps_fma(auVar50,auVar14,local_c0);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar7,local_a0);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar154,local_80);
          auVar51._4_4_ = fVar141 * fVar141;
          auVar51._0_4_ = fVar142 * fVar142;
          auVar51._8_4_ = fVar120 * fVar120;
          auVar51._12_4_ = fVar121 * fVar121;
          auVar51._16_4_ = fVar122 * fVar122;
          auVar51._20_4_ = fVar123 * fVar123;
          auVar51._24_4_ = fVar124 * fVar124;
          auVar51._28_4_ = local_80._28_4_;
          auVar109 = vfmadd231ps_fma(auVar51,auVar112,auVar112);
          auVar191 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar18));
          auVar196._0_4_ = auVar191._0_4_ * auVar191._0_4_ * auVar109._0_4_;
          auVar196._4_4_ = auVar191._4_4_ * auVar191._4_4_ * auVar109._4_4_;
          auVar196._8_4_ = auVar191._8_4_ * auVar191._8_4_ * auVar109._8_4_;
          auVar196._12_4_ = auVar191._12_4_ * auVar191._12_4_ * auVar109._12_4_;
          auVar196._16_4_ = auVar191._16_4_ * auVar191._16_4_ * 0.0;
          auVar196._20_4_ = auVar191._20_4_ * auVar191._20_4_ * 0.0;
          auVar196._24_4_ = auVar191._24_4_ * auVar191._24_4_ * 0.0;
          auVar196._28_4_ = 0;
          auVar52._4_4_ = auVar119._4_4_ * auVar119._4_4_;
          auVar52._0_4_ = auVar119._0_4_ * auVar119._0_4_;
          auVar52._8_4_ = auVar119._8_4_ * auVar119._8_4_;
          auVar52._12_4_ = auVar119._12_4_ * auVar119._12_4_;
          auVar52._16_4_ = auVar119._16_4_ * auVar119._16_4_;
          auVar52._20_4_ = auVar119._20_4_ * auVar119._20_4_;
          auVar52._24_4_ = auVar119._24_4_ * auVar119._24_4_;
          auVar52._28_4_ = auVar119._28_4_;
          auVar191 = vcmpps_avx(auVar52,auVar196,2);
          local_340 = (int)lVar103;
          auVar197._4_4_ = local_340;
          auVar197._0_4_ = local_340;
          auVar197._8_4_ = local_340;
          auVar197._12_4_ = local_340;
          auVar197._16_4_ = local_340;
          auVar197._20_4_ = local_340;
          auVar197._24_4_ = local_340;
          auVar197._28_4_ = local_340;
          auVar119 = vpor_avx2(auVar197,_DAT_01fe9900);
          auVar22 = vpcmpgtd_avx2(local_4a0,auVar119);
          auVar119 = auVar22 & auVar191;
          if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar119 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar119 >> 0x7f,0) == '\0') &&
                (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar119 >> 0xbf,0) == '\0') &&
              (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar119[0x1f]) {
            auVar139 = ZEXT3264(local_680);
            auVar199 = ZEXT3264(auVar195);
            auVar188 = ZEXT3264(CONCAT428(fVar208,CONCAT424(fVar208,CONCAT420(fVar208,CONCAT416(
                                                  fVar208,CONCAT412(fVar208,CONCAT48(fVar208,
                                                  CONCAT44(fVar208,fVar208))))))));
            auVar184 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar157,CONCAT420(fVar163,CONCAT416(
                                                  fVar157,CONCAT412(fVar163,CONCAT48(fVar157,uVar105
                                                                                    )))))));
            uVar98 = uVar98 & 0xffffffff;
          }
          else {
            local_520 = vandps_avx(auVar22,auVar191);
            local_480._0_4_ = auVar93._0_4_;
            local_480._4_4_ = auVar93._4_4_;
            fStack_478 = auVar93._8_4_;
            fStack_474 = auVar93._12_4_;
            fStack_470 = auVar93._16_4_;
            fStack_46c = auVar93._20_4_;
            fStack_468 = auVar93._24_4_;
            auVar53._4_4_ = (float)local_700._4_4_ * (float)local_480._4_4_;
            auVar53._0_4_ = (float)local_700._0_4_ * (float)local_480._0_4_;
            auVar53._8_4_ = fStack_6f8 * fStack_478;
            auVar53._12_4_ = fStack_6f4 * fStack_474;
            auVar53._16_4_ = fStack_6f0 * fStack_470;
            auVar53._20_4_ = fStack_6ec * fStack_46c;
            auVar53._24_4_ = fStack_6e8 * fStack_468;
            auVar53._28_4_ = auVar191._28_4_;
            auVar109 = vfmadd213ps_fma(auVar14,local_580,auVar53);
            auVar109 = vfmadd213ps_fma(auVar7,local_100,ZEXT1632(auVar109));
            auVar109 = vfmadd132ps_fma(auVar154,ZEXT1632(auVar109),local_6a0);
            local_460._0_4_ = auVar92._0_4_;
            local_460._4_4_ = auVar92._4_4_;
            fStack_458 = auVar92._8_4_;
            fStack_454 = auVar92._12_4_;
            fStack_450 = auVar92._16_4_;
            fStack_44c = auVar92._20_4_;
            fStack_448 = auVar92._24_4_;
            auVar160._0_4_ = (float)local_700._0_4_ * (float)local_460._0_4_;
            auVar160._4_4_ = (float)local_700._4_4_ * (float)local_460._4_4_;
            auVar160._8_4_ = fStack_6f8 * fStack_458;
            auVar160._12_4_ = fStack_6f4 * fStack_454;
            auVar160._16_4_ = fStack_6f0 * fStack_450;
            auVar160._20_4_ = fStack_6ec * fStack_44c;
            auVar160._24_4_ = fStack_6e8 * fStack_448;
            auVar160._28_4_ = 0;
            auVar108 = vfmadd213ps_fma(auVar179,local_580,auVar160);
            auVar108 = vfmadd213ps_fma(auVar118,local_100,ZEXT1632(auVar108));
            auVar118 = *(undefined1 (*) [32])(lVar23 + 0x21ab4f4 + lVar103 * 4);
            auVar179 = *(undefined1 (*) [32])(lVar23 + 0x21ab978 + lVar103 * 4);
            auVar154 = *(undefined1 (*) [32])(lVar23 + 0x21abdfc + lVar103 * 4);
            pfVar4 = (float *)(lVar23 + 0x21ac280 + lVar103 * 4);
            fVar142 = *pfVar4;
            fVar141 = pfVar4[1];
            fVar120 = pfVar4[2];
            fVar121 = pfVar4[3];
            fVar122 = pfVar4[4];
            fVar123 = pfVar4[5];
            fVar124 = pfVar4[6];
            auVar54._4_4_ = fVar208 * fVar141;
            auVar54._0_4_ = fVar208 * fVar142;
            auVar54._8_4_ = fVar208 * fVar120;
            auVar54._12_4_ = fVar208 * fVar121;
            auVar54._16_4_ = fVar208 * fVar122;
            auVar54._20_4_ = fVar208 * fVar123;
            auVar54._24_4_ = fVar208 * fVar124;
            auVar54._28_4_ = auVar112._28_4_;
            auVar210._0_4_ = fVar157 * fVar142;
            auVar210._4_4_ = fVar163 * fVar141;
            auVar210._8_4_ = fVar157 * fVar120;
            auVar210._12_4_ = fVar163 * fVar121;
            auVar210._16_4_ = fVar157 * fVar122;
            auVar210._20_4_ = fVar163 * fVar123;
            auVar210._24_4_ = fVar157 * fVar124;
            auVar210._28_4_ = 0;
            auVar55._4_4_ = fVar141 * (float)local_700._4_4_;
            auVar55._0_4_ = fVar142 * (float)local_700._0_4_;
            auVar55._8_4_ = fVar120 * fStack_6f8;
            auVar55._12_4_ = fVar121 * fStack_6f4;
            auVar55._16_4_ = fVar122 * fStack_6f0;
            auVar55._20_4_ = fVar123 * fStack_6ec;
            auVar55._24_4_ = fVar124 * fStack_6e8;
            auVar55._28_4_ = pfVar4[7];
            auVar143 = vfmadd231ps_fma(auVar54,auVar154,auVar149);
            auVar129 = vfmadd231ps_fma(auVar210,auVar154,auVar205);
            auVar107 = vfmadd231ps_fma(auVar55,local_580,auVar154);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar179,auVar201);
            auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar179,auVar219);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_100,auVar179);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar118,auVar216);
            auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar118,local_5a0);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_6a0,auVar118);
            pfVar4 = (float *)(lVar23 + 0x21ae6a0 + lVar103 * 4);
            fVar142 = *pfVar4;
            fVar141 = pfVar4[1];
            fVar120 = pfVar4[2];
            fVar121 = pfVar4[3];
            fVar122 = pfVar4[4];
            fVar123 = pfVar4[5];
            fVar124 = pfVar4[6];
            auVar56._4_4_ = fVar208 * fVar141;
            auVar56._0_4_ = fVar208 * fVar142;
            auVar56._8_4_ = fVar208 * fVar120;
            auVar56._12_4_ = fVar208 * fVar121;
            auVar56._16_4_ = fVar208 * fVar122;
            auVar56._20_4_ = fVar208 * fVar123;
            auVar56._24_4_ = fVar208 * fVar124;
            auVar56._28_4_ = fVar208;
            auVar57._4_4_ = fVar163 * fVar141;
            auVar57._0_4_ = fVar157 * fVar142;
            auVar57._8_4_ = fVar157 * fVar120;
            auVar57._12_4_ = fVar163 * fVar121;
            auVar57._16_4_ = fVar157 * fVar122;
            auVar57._20_4_ = fVar163 * fVar123;
            auVar57._24_4_ = fVar157 * fVar124;
            auVar57._28_4_ = fVar163;
            auVar58._4_4_ = (float)local_700._4_4_ * fVar141;
            auVar58._0_4_ = (float)local_700._0_4_ * fVar142;
            auVar58._8_4_ = fStack_6f8 * fVar120;
            auVar58._12_4_ = fStack_6f4 * fVar121;
            auVar58._16_4_ = fStack_6f0 * fVar122;
            auVar58._20_4_ = fStack_6ec * fVar123;
            auVar58._24_4_ = fStack_6e8 * fVar124;
            auVar58._28_4_ = pfVar4[7];
            auVar118 = *(undefined1 (*) [32])(lVar23 + 0x21ae21c + lVar103 * 4);
            auVar130 = vfmadd231ps_fma(auVar56,auVar118,auVar149);
            auVar158 = vfmadd231ps_fma(auVar57,auVar118,auVar205);
            auVar165 = vfmadd231ps_fma(auVar58,local_580,auVar118);
            auVar118 = *(undefined1 (*) [32])(lVar23 + 0x21add98 + lVar103 * 4);
            auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar118,auVar201);
            auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar118,auVar219);
            auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),local_100,auVar118);
            auVar118 = *(undefined1 (*) [32])(lVar23 + 0x21ad914 + lVar103 * 4);
            auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar118,auVar216);
            auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar118,local_5a0);
            auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),local_6a0,auVar118);
            auVar198._8_4_ = 0x7fffffff;
            auVar198._0_8_ = 0x7fffffff7fffffff;
            auVar198._12_4_ = 0x7fffffff;
            auVar198._16_4_ = 0x7fffffff;
            auVar198._20_4_ = 0x7fffffff;
            auVar198._24_4_ = 0x7fffffff;
            auVar198._28_4_ = 0x7fffffff;
            auVar118 = vandps_avx(ZEXT1632(auVar143),auVar198);
            auVar179 = vandps_avx(ZEXT1632(auVar129),auVar198);
            auVar179 = vmaxps_avx(auVar118,auVar179);
            auVar118 = vandps_avx(ZEXT1632(auVar107),auVar198);
            auVar118 = vmaxps_avx(auVar179,auVar118);
            auVar118 = vcmpps_avx(auVar118,_local_4c0,1);
            auVar154 = vblendvps_avx(ZEXT1632(auVar143),auVar112,auVar118);
            auVar7 = vblendvps_avx(ZEXT1632(auVar129),local_420,auVar118);
            auVar118 = vandps_avx(ZEXT1632(auVar130),auVar198);
            auVar179 = vandps_avx(ZEXT1632(auVar158),auVar198);
            auVar179 = vmaxps_avx(auVar118,auVar179);
            auVar118 = vandps_avx(auVar198,ZEXT1632(auVar165));
            auVar118 = vmaxps_avx(auVar179,auVar118);
            auVar179 = vcmpps_avx(auVar118,_local_4c0,1);
            auVar118 = vblendvps_avx(ZEXT1632(auVar130),auVar112,auVar179);
            auVar179 = vblendvps_avx(ZEXT1632(auVar158),local_420,auVar179);
            auVar108 = vfmadd213ps_fma(auVar137,local_6a0,ZEXT1632(auVar108));
            auVar143 = vfmadd213ps_fma(auVar154,auVar154,ZEXT832(0) << 0x20);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar7,auVar7);
            auVar137 = vrsqrtps_avx(ZEXT1632(auVar143));
            fVar142 = auVar137._0_4_;
            fVar141 = auVar137._4_4_;
            fVar120 = auVar137._8_4_;
            fVar121 = auVar137._12_4_;
            fVar122 = auVar137._16_4_;
            fVar123 = auVar137._20_4_;
            fVar124 = auVar137._24_4_;
            auVar59._4_4_ = fVar141 * fVar141 * fVar141 * auVar143._4_4_ * -0.5;
            auVar59._0_4_ = fVar142 * fVar142 * fVar142 * auVar143._0_4_ * -0.5;
            auVar59._8_4_ = fVar120 * fVar120 * fVar120 * auVar143._8_4_ * -0.5;
            auVar59._12_4_ = fVar121 * fVar121 * fVar121 * auVar143._12_4_ * -0.5;
            auVar59._16_4_ = fVar122 * fVar122 * fVar122 * -0.0;
            auVar59._20_4_ = fVar123 * fVar123 * fVar123 * -0.0;
            auVar59._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
            auVar59._28_4_ = 0;
            auVar218._8_4_ = 0x3fc00000;
            auVar218._0_8_ = 0x3fc000003fc00000;
            auVar218._12_4_ = 0x3fc00000;
            auVar218._16_4_ = 0x3fc00000;
            auVar218._20_4_ = 0x3fc00000;
            auVar218._24_4_ = 0x3fc00000;
            auVar218._28_4_ = 0x3fc00000;
            auVar143 = vfmadd231ps_fma(auVar59,auVar218,auVar137);
            fVar142 = auVar143._0_4_;
            fVar141 = auVar143._4_4_;
            auVar60._4_4_ = auVar7._4_4_ * fVar141;
            auVar60._0_4_ = auVar7._0_4_ * fVar142;
            fVar120 = auVar143._8_4_;
            auVar60._8_4_ = auVar7._8_4_ * fVar120;
            fVar121 = auVar143._12_4_;
            auVar60._12_4_ = auVar7._12_4_ * fVar121;
            auVar60._16_4_ = auVar7._16_4_ * 0.0;
            auVar60._20_4_ = auVar7._20_4_ * 0.0;
            auVar60._24_4_ = auVar7._24_4_ * 0.0;
            auVar60._28_4_ = auVar137._28_4_;
            auVar61._4_4_ = fVar141 * -auVar154._4_4_;
            auVar61._0_4_ = fVar142 * -auVar154._0_4_;
            auVar61._8_4_ = fVar120 * -auVar154._8_4_;
            auVar61._12_4_ = fVar121 * -auVar154._12_4_;
            auVar61._16_4_ = -auVar154._16_4_ * 0.0;
            auVar61._20_4_ = -auVar154._20_4_ * 0.0;
            auVar61._24_4_ = -auVar154._24_4_ * 0.0;
            auVar61._28_4_ = auVar7._28_4_;
            auVar143 = vfmadd213ps_fma(auVar118,auVar118,ZEXT832(0) << 0x20);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar179,auVar179);
            auVar137 = vrsqrtps_avx(ZEXT1632(auVar143));
            auVar62._28_4_ = auVar112._28_4_;
            auVar62._0_28_ =
                 ZEXT1628(CONCAT412(fVar121 * 0.0,
                                    CONCAT48(fVar120 * 0.0,CONCAT44(fVar141 * 0.0,fVar142 * 0.0))));
            fVar142 = auVar137._0_4_;
            fVar141 = auVar137._4_4_;
            fVar120 = auVar137._8_4_;
            fVar121 = auVar137._12_4_;
            fVar122 = auVar137._16_4_;
            fVar123 = auVar137._20_4_;
            fVar124 = auVar137._24_4_;
            auVar63._4_4_ = fVar141 * fVar141 * fVar141 * auVar143._4_4_ * -0.5;
            auVar63._0_4_ = fVar142 * fVar142 * fVar142 * auVar143._0_4_ * -0.5;
            auVar63._8_4_ = fVar120 * fVar120 * fVar120 * auVar143._8_4_ * -0.5;
            auVar63._12_4_ = fVar121 * fVar121 * fVar121 * auVar143._12_4_ * -0.5;
            auVar63._16_4_ = fVar122 * fVar122 * fVar122 * -0.0;
            auVar63._20_4_ = fVar123 * fVar123 * fVar123 * -0.0;
            auVar63._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
            auVar63._28_4_ = 0;
            auVar143 = vfmadd231ps_fma(auVar63,auVar218,auVar137);
            fVar142 = auVar143._0_4_;
            fVar141 = auVar143._4_4_;
            auVar64._4_4_ = auVar179._4_4_ * fVar141;
            auVar64._0_4_ = auVar179._0_4_ * fVar142;
            fVar120 = auVar143._8_4_;
            auVar64._8_4_ = auVar179._8_4_ * fVar120;
            fVar121 = auVar143._12_4_;
            auVar64._12_4_ = auVar179._12_4_ * fVar121;
            auVar64._16_4_ = auVar179._16_4_ * 0.0;
            auVar64._20_4_ = auVar179._20_4_ * 0.0;
            auVar64._24_4_ = auVar179._24_4_ * 0.0;
            auVar64._28_4_ = 0;
            auVar65._4_4_ = fVar141 * -auVar118._4_4_;
            auVar65._0_4_ = fVar142 * -auVar118._0_4_;
            auVar65._8_4_ = fVar120 * -auVar118._8_4_;
            auVar65._12_4_ = fVar121 * -auVar118._12_4_;
            auVar65._16_4_ = -auVar118._16_4_ * 0.0;
            auVar65._20_4_ = -auVar118._20_4_ * 0.0;
            auVar65._24_4_ = -auVar118._24_4_ * 0.0;
            auVar65._28_4_ = auVar137._28_4_;
            auVar66._28_4_ = 0xbf000000;
            auVar66._0_28_ =
                 ZEXT1628(CONCAT412(fVar121 * 0.0,
                                    CONCAT48(fVar120 * 0.0,CONCAT44(fVar141 * 0.0,fVar142 * 0.0))));
            auVar143 = vfmadd213ps_fma(auVar60,ZEXT1632(auVar12),local_400);
            auVar137 = ZEXT1632(auVar12);
            auVar129 = vfmadd213ps_fma(auVar61,auVar137,local_660);
            auVar107 = vfmadd213ps_fma(auVar62,auVar137,ZEXT1632(auVar108));
            auVar106 = vfnmadd213ps_fma(auVar60,auVar137,local_400);
            auVar130 = vfmadd213ps_fma(auVar64,ZEXT1632(auVar18),local_440);
            auVar128 = vfnmadd213ps_fma(auVar61,auVar137,local_660);
            auVar137 = ZEXT1632(auVar18);
            auVar158 = vfmadd213ps_fma(auVar65,auVar137,local_640);
            auVar159 = ZEXT1632(auVar12);
            auVar172 = vfnmadd231ps_fma(ZEXT1632(auVar108),auVar159,auVar62);
            auVar108 = vfmadd213ps_fma(auVar66,auVar137,ZEXT1632(auVar109));
            auVar164 = vfnmadd213ps_fma(auVar64,auVar137,local_440);
            auVar171 = vfnmadd213ps_fma(auVar65,auVar137,local_640);
            auVar173 = vfnmadd231ps_fma(ZEXT1632(auVar109),ZEXT1632(auVar18),auVar66);
            auVar137 = vsubps_avx(ZEXT1632(auVar158),ZEXT1632(auVar128));
            auVar118 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar172));
            auVar182._0_4_ = auVar137._0_4_ * auVar172._0_4_;
            auVar182._4_4_ = auVar137._4_4_ * auVar172._4_4_;
            auVar182._8_4_ = auVar137._8_4_ * auVar172._8_4_;
            auVar182._12_4_ = auVar137._12_4_ * auVar172._12_4_;
            auVar182._16_4_ = auVar137._16_4_ * 0.0;
            auVar182._20_4_ = auVar137._20_4_ * 0.0;
            auVar182._24_4_ = auVar137._24_4_ * 0.0;
            auVar182._28_4_ = 0;
            auVar165 = vfmsub231ps_fma(auVar182,ZEXT1632(auVar128),auVar118);
            auVar67._4_4_ = auVar106._4_4_ * auVar118._4_4_;
            auVar67._0_4_ = auVar106._0_4_ * auVar118._0_4_;
            auVar67._8_4_ = auVar106._8_4_ * auVar118._8_4_;
            auVar67._12_4_ = auVar106._12_4_ * auVar118._12_4_;
            auVar67._16_4_ = auVar118._16_4_ * 0.0;
            auVar67._20_4_ = auVar118._20_4_ * 0.0;
            auVar67._24_4_ = auVar118._24_4_ * 0.0;
            auVar67._28_4_ = auVar118._28_4_;
            auVar191 = ZEXT1632(auVar106);
            auVar118 = vsubps_avx(ZEXT1632(auVar130),auVar191);
            auVar119 = ZEXT1632(auVar172);
            auVar109 = vfmsub231ps_fma(auVar67,auVar119,auVar118);
            auVar68._4_4_ = auVar128._4_4_ * auVar118._4_4_;
            auVar68._0_4_ = auVar128._0_4_ * auVar118._0_4_;
            auVar68._8_4_ = auVar128._8_4_ * auVar118._8_4_;
            auVar68._12_4_ = auVar128._12_4_ * auVar118._12_4_;
            auVar68._16_4_ = auVar118._16_4_ * 0.0;
            auVar68._20_4_ = auVar118._20_4_ * 0.0;
            auVar68._24_4_ = auVar118._24_4_ * 0.0;
            auVar68._28_4_ = auVar118._28_4_;
            auVar106 = vfmsub231ps_fma(auVar68,auVar191,auVar137);
            auVar109 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar109));
            auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),ZEXT832(0) << 0x20,ZEXT1632(auVar165));
            auVar22 = vcmpps_avx(ZEXT1632(auVar109),ZEXT832(0) << 0x20,2);
            auVar137 = vblendvps_avx(ZEXT1632(auVar164),ZEXT1632(auVar143),auVar22);
            auVar118 = vblendvps_avx(ZEXT1632(auVar171),ZEXT1632(auVar129),auVar22);
            auVar179 = vblendvps_avx(ZEXT1632(auVar173),ZEXT1632(auVar107),auVar22);
            auVar154 = vblendvps_avx(auVar191,ZEXT1632(auVar130),auVar22);
            auVar7 = vblendvps_avx(ZEXT1632(auVar128),ZEXT1632(auVar158),auVar22);
            auVar14 = vblendvps_avx(auVar119,ZEXT1632(auVar108),auVar22);
            auVar191 = vblendvps_avx(ZEXT1632(auVar130),auVar191,auVar22);
            auVar112 = vblendvps_avx(ZEXT1632(auVar158),ZEXT1632(auVar128),auVar22);
            auVar109 = vpackssdw_avx(local_520._0_16_,local_520._16_16_);
            auVar119 = vblendvps_avx(ZEXT1632(auVar108),auVar119,auVar22);
            auVar191 = vsubps_avx(auVar191,auVar137);
            auVar112 = vsubps_avx(auVar112,auVar118);
            auVar20 = vsubps_avx(auVar119,auVar179);
            auVar21 = vsubps_avx(auVar137,auVar154);
            auVar113 = vsubps_avx(auVar118,auVar7);
            auVar131 = vsubps_avx(auVar179,auVar14);
            auVar176._0_4_ = auVar20._0_4_ * auVar137._0_4_;
            auVar176._4_4_ = auVar20._4_4_ * auVar137._4_4_;
            auVar176._8_4_ = auVar20._8_4_ * auVar137._8_4_;
            auVar176._12_4_ = auVar20._12_4_ * auVar137._12_4_;
            auVar176._16_4_ = auVar20._16_4_ * auVar137._16_4_;
            auVar176._20_4_ = auVar20._20_4_ * auVar137._20_4_;
            auVar176._24_4_ = auVar20._24_4_ * auVar137._24_4_;
            auVar176._28_4_ = 0;
            auVar108 = vfmsub231ps_fma(auVar176,auVar179,auVar191);
            auVar69._4_4_ = auVar191._4_4_ * auVar118._4_4_;
            auVar69._0_4_ = auVar191._0_4_ * auVar118._0_4_;
            auVar69._8_4_ = auVar191._8_4_ * auVar118._8_4_;
            auVar69._12_4_ = auVar191._12_4_ * auVar118._12_4_;
            auVar69._16_4_ = auVar191._16_4_ * auVar118._16_4_;
            auVar69._20_4_ = auVar191._20_4_ * auVar118._20_4_;
            auVar69._24_4_ = auVar191._24_4_ * auVar118._24_4_;
            auVar69._28_4_ = auVar119._28_4_;
            auVar143 = vfmsub231ps_fma(auVar69,auVar137,auVar112);
            auVar213 = ZEXT864(0) << 0x20;
            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar143),ZEXT832(0) << 0x20,ZEXT1632(auVar108));
            auVar177._0_4_ = auVar112._0_4_ * auVar179._0_4_;
            auVar177._4_4_ = auVar112._4_4_ * auVar179._4_4_;
            auVar177._8_4_ = auVar112._8_4_ * auVar179._8_4_;
            auVar177._12_4_ = auVar112._12_4_ * auVar179._12_4_;
            auVar177._16_4_ = auVar112._16_4_ * auVar179._16_4_;
            auVar177._20_4_ = auVar112._20_4_ * auVar179._20_4_;
            auVar177._24_4_ = auVar112._24_4_ * auVar179._24_4_;
            auVar177._28_4_ = 0;
            auVar143 = vfmsub231ps_fma(auVar177,auVar118,auVar20);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar108),ZEXT832(0) << 0x20,ZEXT1632(auVar143));
            auVar178._0_4_ = auVar131._0_4_ * auVar154._0_4_;
            auVar178._4_4_ = auVar131._4_4_ * auVar154._4_4_;
            auVar178._8_4_ = auVar131._8_4_ * auVar154._8_4_;
            auVar178._12_4_ = auVar131._12_4_ * auVar154._12_4_;
            auVar178._16_4_ = auVar131._16_4_ * auVar154._16_4_;
            auVar178._20_4_ = auVar131._20_4_ * auVar154._20_4_;
            auVar178._24_4_ = auVar131._24_4_ * auVar154._24_4_;
            auVar178._28_4_ = 0;
            auVar108 = vfmsub231ps_fma(auVar178,auVar21,auVar14);
            auVar70._4_4_ = auVar113._4_4_ * auVar14._4_4_;
            auVar70._0_4_ = auVar113._0_4_ * auVar14._0_4_;
            auVar70._8_4_ = auVar113._8_4_ * auVar14._8_4_;
            auVar70._12_4_ = auVar113._12_4_ * auVar14._12_4_;
            auVar70._16_4_ = auVar113._16_4_ * auVar14._16_4_;
            auVar70._20_4_ = auVar113._20_4_ * auVar14._20_4_;
            auVar70._24_4_ = auVar113._24_4_ * auVar14._24_4_;
            auVar70._28_4_ = auVar14._28_4_;
            auVar129 = vfmsub231ps_fma(auVar70,auVar7,auVar131);
            auVar71._4_4_ = auVar21._4_4_ * auVar7._4_4_;
            auVar71._0_4_ = auVar21._0_4_ * auVar7._0_4_;
            auVar71._8_4_ = auVar21._8_4_ * auVar7._8_4_;
            auVar71._12_4_ = auVar21._12_4_ * auVar7._12_4_;
            auVar71._16_4_ = auVar21._16_4_ * auVar7._16_4_;
            auVar71._20_4_ = auVar21._20_4_ * auVar7._20_4_;
            auVar71._24_4_ = auVar21._24_4_ * auVar7._24_4_;
            auVar71._28_4_ = auVar7._28_4_;
            auVar107 = vfmsub231ps_fma(auVar71,auVar113,auVar154);
            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar108));
            auVar129 = vfmadd231ps_fma(ZEXT1632(auVar108),ZEXT832(0) << 0x20,ZEXT1632(auVar129));
            auVar154 = vmaxps_avx(ZEXT1632(auVar143),ZEXT1632(auVar129));
            auVar154 = vcmpps_avx(auVar154,ZEXT832(0) << 0x20,2);
            auVar108 = vpackssdw_avx(auVar154._0_16_,auVar154._16_16_);
            auVar108 = vpand_avx(auVar108,auVar109);
            auVar154 = vpmovsxwd_avx2(auVar108);
            if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar154 >> 0x7f,0) == '\0') &&
                  (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar154 >> 0xbf,0) == '\0') &&
                (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar154[0x1f]) {
              auVar162._8_8_ = uStack_5d8;
              auVar162._0_8_ = local_5e0;
              auVar162._16_8_ = uStack_5d0;
              auVar162._24_8_ = uStack_5c8;
              auVar199 = ZEXT3264(auVar195);
            }
            else {
              auVar72._4_4_ = auVar112._4_4_ * auVar131._4_4_;
              auVar72._0_4_ = auVar112._0_4_ * auVar131._0_4_;
              auVar72._8_4_ = auVar112._8_4_ * auVar131._8_4_;
              auVar72._12_4_ = auVar112._12_4_ * auVar131._12_4_;
              auVar72._16_4_ = auVar112._16_4_ * auVar131._16_4_;
              auVar72._20_4_ = auVar112._20_4_ * auVar131._20_4_;
              auVar72._24_4_ = auVar112._24_4_ * auVar131._24_4_;
              auVar72._28_4_ = auVar154._28_4_;
              auVar165 = vfmsub231ps_fma(auVar72,auVar113,auVar20);
              auVar183._0_4_ = auVar21._0_4_ * auVar20._0_4_;
              auVar183._4_4_ = auVar21._4_4_ * auVar20._4_4_;
              auVar183._8_4_ = auVar21._8_4_ * auVar20._8_4_;
              auVar183._12_4_ = auVar21._12_4_ * auVar20._12_4_;
              auVar183._16_4_ = auVar21._16_4_ * auVar20._16_4_;
              auVar183._20_4_ = auVar21._20_4_ * auVar20._20_4_;
              auVar183._24_4_ = auVar21._24_4_ * auVar20._24_4_;
              auVar183._28_4_ = 0;
              auVar158 = vfmsub231ps_fma(auVar183,auVar191,auVar131);
              auVar73._4_4_ = auVar191._4_4_ * auVar113._4_4_;
              auVar73._0_4_ = auVar191._0_4_ * auVar113._0_4_;
              auVar73._8_4_ = auVar191._8_4_ * auVar113._8_4_;
              auVar73._12_4_ = auVar191._12_4_ * auVar113._12_4_;
              auVar73._16_4_ = auVar191._16_4_ * auVar113._16_4_;
              auVar73._20_4_ = auVar191._20_4_ * auVar113._20_4_;
              auVar73._24_4_ = auVar191._24_4_ * auVar113._24_4_;
              auVar73._28_4_ = auVar113._28_4_;
              auVar106 = vfmsub231ps_fma(auVar73,auVar21,auVar112);
              auVar107 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar158),ZEXT1632(auVar106));
              auVar130 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar165),ZEXT832(0) << 0x20);
              auVar154 = vrcpps_avx(ZEXT1632(auVar130));
              auVar211._8_4_ = 0x3f800000;
              auVar211._0_8_ = 0x3f8000003f800000;
              auVar211._12_4_ = 0x3f800000;
              auVar211._16_4_ = 0x3f800000;
              auVar211._20_4_ = 0x3f800000;
              auVar211._24_4_ = 0x3f800000;
              auVar211._28_4_ = 0x3f800000;
              auVar213 = ZEXT3264(auVar211);
              auVar107 = vfnmadd213ps_fma(auVar154,ZEXT1632(auVar130),auVar211);
              auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar154,auVar154);
              auVar74._4_4_ = auVar106._4_4_ * auVar179._4_4_;
              auVar74._0_4_ = auVar106._0_4_ * auVar179._0_4_;
              auVar74._8_4_ = auVar106._8_4_ * auVar179._8_4_;
              auVar74._12_4_ = auVar106._12_4_ * auVar179._12_4_;
              auVar74._16_4_ = auVar179._16_4_ * 0.0;
              auVar74._20_4_ = auVar179._20_4_ * 0.0;
              auVar74._24_4_ = auVar179._24_4_ * 0.0;
              auVar74._28_4_ = auVar179._28_4_;
              auVar158 = vfmadd231ps_fma(auVar74,ZEXT1632(auVar158),auVar118);
              auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),ZEXT1632(auVar165),auVar137);
              fVar142 = auVar107._0_4_;
              fVar141 = auVar107._4_4_;
              fVar120 = auVar107._8_4_;
              fVar121 = auVar107._12_4_;
              auVar179 = ZEXT1632(CONCAT412(fVar121 * auVar158._12_4_,
                                            CONCAT48(fVar120 * auVar158._8_4_,
                                                     CONCAT44(fVar141 * auVar158._4_4_,
                                                              fVar142 * auVar158._0_4_))));
              uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar161._4_4_ = uVar104;
              auVar161._0_4_ = uVar104;
              auVar161._8_4_ = uVar104;
              auVar161._12_4_ = uVar104;
              auVar161._16_4_ = uVar104;
              auVar161._20_4_ = uVar104;
              auVar161._24_4_ = uVar104;
              auVar161._28_4_ = uVar104;
              auVar91._4_4_ = uStack_5bc;
              auVar91._0_4_ = local_5c0;
              auVar91._8_4_ = uStack_5b8;
              auVar91._12_4_ = uStack_5b4;
              auVar91._16_4_ = uStack_5b0;
              auVar91._20_4_ = uStack_5ac;
              auVar91._24_4_ = uStack_5a8;
              auVar91._28_4_ = uStack_5a4;
              auVar137 = vcmpps_avx(auVar91,auVar179,2);
              auVar118 = vcmpps_avx(auVar179,auVar161,2);
              auVar137 = vandps_avx(auVar118,auVar137);
              auVar107 = vpackssdw_avx(auVar137._0_16_,auVar137._16_16_);
              auVar108 = vpand_avx(auVar108,auVar107);
              auVar137 = vpmovsxwd_avx2(auVar108);
              if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar137 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar137 >> 0x7f,0) == '\0') &&
                    (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar137 >> 0xbf,0) == '\0') &&
                  (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar137[0x1f]) {
                auVar162._8_8_ = uStack_5d8;
                auVar162._0_8_ = local_5e0;
                auVar162._16_8_ = uStack_5d0;
                auVar162._24_8_ = uStack_5c8;
                auVar199 = ZEXT3264(auVar195);
              }
              else {
                auVar137 = vcmpps_avx(ZEXT1632(auVar130),ZEXT832(0) << 0x20,4);
                auVar107 = vpackssdw_avx(auVar137._0_16_,auVar137._16_16_);
                auVar108 = vpand_avx(auVar108,auVar107);
                auVar137 = vpmovsxwd_avx2(auVar108);
                auVar162._8_8_ = uStack_5d8;
                auVar162._0_8_ = local_5e0;
                auVar162._16_8_ = uStack_5d0;
                auVar162._24_8_ = uStack_5c8;
                auVar199 = ZEXT3264(auVar195);
                if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar137 >> 0x7f,0) != '\0') ||
                      (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar137 >> 0xbf,0) != '\0') ||
                    (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar137[0x1f] < '\0') {
                  auVar154 = ZEXT1632(CONCAT412(fVar121 * auVar143._12_4_,
                                                CONCAT48(fVar120 * auVar143._8_4_,
                                                         CONCAT44(fVar141 * auVar143._4_4_,
                                                                  fVar142 * auVar143._0_4_))));
                  auVar75._28_4_ = SUB84(uStack_5c8,4);
                  auVar75._0_28_ =
                       ZEXT1628(CONCAT412(fVar121 * auVar129._12_4_,
                                          CONCAT48(fVar120 * auVar129._8_4_,
                                                   CONCAT44(fVar141 * auVar129._4_4_,
                                                            fVar142 * auVar129._0_4_))));
                  auVar192._8_4_ = 0x3f800000;
                  auVar192._0_8_ = 0x3f8000003f800000;
                  auVar192._12_4_ = 0x3f800000;
                  auVar192._16_4_ = 0x3f800000;
                  auVar192._20_4_ = 0x3f800000;
                  auVar192._24_4_ = 0x3f800000;
                  auVar192._28_4_ = 0x3f800000;
                  auVar118 = vsubps_avx(auVar192,auVar154);
                  local_680 = vblendvps_avx(auVar118,auVar154,auVar22);
                  auVar118 = vsubps_avx(auVar192,auVar75);
                  local_500 = vblendvps_avx(auVar118,auVar75,auVar22);
                  auVar199 = ZEXT3264(auVar179);
                  auVar162 = auVar137;
                }
              }
            }
            auVar207 = ZEXT3264(auVar111);
            uVar98 = uVar98 & 0xffffffff;
            if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar162 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar162 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar162 >> 0x7f,0) == '\0') &&
                  (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar162 >> 0xbf,0) == '\0') &&
                (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar162[0x1f]) {
              auVar139 = ZEXT3264(local_680);
              auVar188 = ZEXT3264(CONCAT428(fVar208,CONCAT424(fVar208,CONCAT420(fVar208,CONCAT416(
                                                  fVar208,CONCAT412(fVar208,CONCAT48(fVar208,
                                                  CONCAT44(fVar208,fVar208))))))));
              auVar184 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar157,CONCAT420(fVar163,CONCAT416(
                                                  fVar157,CONCAT412(fVar163,CONCAT48(fVar157,uVar105
                                                                                    )))))));
            }
            else {
              auVar137 = vsubps_avx(ZEXT1632(auVar18),auVar159);
              auVar18 = vfmadd213ps_fma(auVar137,local_680,auVar159);
              fVar142 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar76._4_4_ = (auVar18._4_4_ + auVar18._4_4_) * fVar142;
              auVar76._0_4_ = (auVar18._0_4_ + auVar18._0_4_) * fVar142;
              auVar76._8_4_ = (auVar18._8_4_ + auVar18._8_4_) * fVar142;
              auVar76._12_4_ = (auVar18._12_4_ + auVar18._12_4_) * fVar142;
              auVar76._16_4_ = fVar142 * 0.0;
              auVar76._20_4_ = fVar142 * 0.0;
              auVar76._24_4_ = fVar142 * 0.0;
              auVar76._28_4_ = fVar142;
              local_6e0 = auVar199._0_32_;
              auVar137 = vcmpps_avx(local_6e0,auVar76,6);
              auVar118 = auVar162 & auVar137;
              auVar188 = ZEXT3264(CONCAT428(fVar208,CONCAT424(fVar208,CONCAT420(fVar208,CONCAT416(
                                                  fVar208,CONCAT412(fVar208,CONCAT48(fVar208,
                                                  CONCAT44(fVar208,fVar208))))))));
              auVar184 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar157,CONCAT420(fVar163,CONCAT416(
                                                  fVar157,CONCAT412(fVar163,CONCAT48(fVar157,uVar105
                                                                                    )))))));
              if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar118 >> 0x7f,0) == '\0') &&
                    (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar118 >> 0xbf,0) == '\0') &&
                  (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar118[0x1f]) {
                auVar139 = ZEXT3264(local_680);
              }
              else {
                auVar138._8_4_ = 0xbf800000;
                auVar138._0_8_ = 0xbf800000bf800000;
                auVar138._12_4_ = 0xbf800000;
                auVar138._16_4_ = 0xbf800000;
                auVar138._20_4_ = 0xbf800000;
                auVar138._24_4_ = 0xbf800000;
                auVar138._28_4_ = 0xbf800000;
                auVar155._8_4_ = 0x40000000;
                auVar155._0_8_ = 0x4000000040000000;
                auVar155._12_4_ = 0x40000000;
                auVar155._16_4_ = 0x40000000;
                auVar155._20_4_ = 0x40000000;
                auVar155._24_4_ = 0x40000000;
                auVar155._28_4_ = 0x40000000;
                auVar18 = vfmadd213ps_fma(local_500,auVar155,auVar138);
                local_3a0 = local_680;
                local_380 = ZEXT1632(auVar18);
                local_320 = local_740;
                uStack_318 = uStack_738;
                local_310 = local_750;
                uStack_308 = uStack_748;
                pGVar9 = (context->scene->geometries).items[uVar100].ptr;
                auVar139 = ZEXT3264(local_680);
                local_500 = local_380;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar95 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar95 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar137 = vandps_avx(auVar137,auVar162);
                  fVar142 = (float)local_340;
                  local_2c0[0] = (fVar142 + local_680._0_4_ + 0.0) * local_140;
                  local_2c0[1] = (fVar142 + local_680._4_4_ + 1.0) * fStack_13c;
                  local_2c0[2] = (fVar142 + local_680._8_4_ + 2.0) * fStack_138;
                  local_2c0[3] = (fVar142 + local_680._12_4_ + 3.0) * fStack_134;
                  fStack_2b0 = (fVar142 + local_680._16_4_ + 4.0) * fStack_130;
                  fStack_2ac = (fVar142 + local_680._20_4_ + 5.0) * fStack_12c;
                  fStack_2a8 = (fVar142 + local_680._24_4_ + 6.0) * fStack_128;
                  fStack_2a4 = fVar142 + local_680._28_4_ + 7.0;
                  local_500._0_8_ = auVar18._0_8_;
                  local_500._8_8_ = auVar18._8_8_;
                  local_2a0 = local_500._0_8_;
                  uStack_298 = local_500._8_8_;
                  uStack_290 = 0;
                  uStack_288 = 0;
                  local_280 = local_6e0;
                  uVar97 = vmovmskps_avx(auVar137);
                  if (uVar97 == 0) {
                    bVar95 = 0;
LAB_015a316f:
                    auVar139 = ZEXT3264(local_680);
                    auVar199 = ZEXT3264(local_6e0);
                    auVar188 = ZEXT3264(CONCAT428(fVar208,CONCAT424(fVar208,CONCAT420(fVar208,
                                                  CONCAT416(fVar208,CONCAT412(fVar208,CONCAT48(
                                                  fVar208,CONCAT44(fVar208,fVar208))))))));
                    auVar184 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar157,CONCAT420(fVar163,
                                                  CONCAT416(fVar157,CONCAT412(fVar163,CONCAT48(
                                                  fVar157,uVar105)))))));
                  }
                  else {
                    uVar98 = (ulong)(uVar97 & 0xff);
                    _local_820 = ZEXT1632(CONCAT88(auVar12._8_8_,uVar98));
                    lVar24 = 0;
                    for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
                      lVar24 = lVar24 + 1;
                    }
                    local_920 = ZEXT1632(CONCAT88(auVar109._8_8_,lVar24));
                    local_660 = ZEXT1632(CONCAT124(auVar17._4_12_,
                                                   *(undefined4 *)(ray + k * 4 + 0x100)));
                    _local_480 = *pauVar3;
                    _local_460 = *pauVar2;
                    local_360 = local_6e0;
                    local_33c = iVar96;
                    local_330 = uVar89;
                    uStack_328 = uVar90;
                    do {
                      local_200 = local_2c0[local_920._0_8_];
                      local_1e0 = *(undefined4 *)((long)&local_2a0 + local_920._0_8_ * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_280 + local_920._0_8_ * 4);
                      fVar120 = 1.0 - local_200;
                      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar120 * fVar120)),
                                                ZEXT416((uint)(local_200 * fVar120)),
                                                ZEXT416(0xc0000000));
                      auVar12 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar120)),
                                                ZEXT416((uint)(local_200 * local_200)),
                                                ZEXT416(0x40000000));
                      fVar142 = auVar12._0_4_ * 3.0;
                      fVar141 = local_200 * local_200 * 3.0;
                      auVar175._0_4_ = fVar141 * (float)local_5f0._0_4_;
                      auVar175._4_4_ = fVar141 * (float)local_5f0._4_4_;
                      auVar175._8_4_ = fVar141 * fStack_5e8;
                      auVar175._12_4_ = fVar141 * fStack_5e4;
                      auVar147._4_4_ = fVar142;
                      auVar147._0_4_ = fVar142;
                      auVar147._8_4_ = fVar142;
                      auVar147._12_4_ = fVar142;
                      auVar12 = vfmadd132ps_fma(auVar147,auVar175,auVar16);
                      fVar142 = auVar17._0_4_ * 3.0;
                      auVar168._4_4_ = fVar142;
                      auVar168._0_4_ = fVar142;
                      auVar168._8_4_ = fVar142;
                      auVar168._12_4_ = fVar142;
                      auVar12 = vfmadd132ps_fma(auVar168,auVar12,auVar15);
                      fVar142 = fVar120 * fVar120 * -3.0;
                      local_730.context = context->user;
                      auVar148._4_4_ = fVar142;
                      auVar148._0_4_ = fVar142;
                      auVar148._8_4_ = fVar142;
                      auVar148._12_4_ = fVar142;
                      auVar17 = vfmadd132ps_fma(auVar148,auVar12,auVar13);
                      local_260 = auVar17._0_4_;
                      uStack_25c = local_260;
                      uStack_258 = local_260;
                      uStack_254 = local_260;
                      uStack_250 = local_260;
                      uStack_24c = local_260;
                      uStack_248 = local_260;
                      uStack_244 = local_260;
                      auVar12 = vmovshdup_avx(auVar17);
                      local_240 = auVar12._0_8_;
                      uStack_238 = local_240;
                      uStack_230 = local_240;
                      uStack_228 = local_240;
                      auVar12 = vshufps_avx(auVar17,auVar17,0xaa);
                      local_220._8_8_ = auVar12._0_8_;
                      local_220._0_8_ = local_220._8_8_;
                      local_220._16_8_ = local_220._8_8_;
                      local_220._24_8_ = local_220._8_8_;
                      fStack_1fc = local_200;
                      fStack_1f8 = local_200;
                      fStack_1f4 = local_200;
                      fStack_1f0 = local_200;
                      fStack_1ec = local_200;
                      fStack_1e8 = local_200;
                      fStack_1e4 = local_200;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = CONCAT44(uStack_53c,local_540);
                      uStack_1b8 = CONCAT44(uStack_534,uStack_538);
                      uStack_1b0 = CONCAT44(uStack_52c,uStack_530);
                      uStack_1a8 = CONCAT44(uStack_524,uStack_528);
                      local_1a0._4_4_ = uStack_11c;
                      local_1a0._0_4_ = local_120;
                      local_1a0._8_4_ = uStack_118;
                      local_1a0._12_4_ = uStack_114;
                      local_1a0._16_4_ = uStack_110;
                      local_1a0._20_4_ = uStack_10c;
                      local_1a0._24_4_ = uStack_108;
                      local_1a0._28_4_ = uStack_104;
                      vpcmpeqd_avx2(local_1a0,local_1a0);
                      local_180 = (local_730.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_730.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_620 = local_3c0;
                      local_730.valid = (int *)local_620;
                      local_730.geometryUserPtr = pGVar9->userPtr;
                      local_730.hit = (RTCHitN *)&local_260;
                      local_730.N = 8;
                      local_730.ray = (RTCRayN *)ray;
                      if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar213 = ZEXT1664(auVar213._0_16_);
                        (*pGVar9->occlusionFilterN)(&local_730);
                      }
                      auVar118 = vpcmpeqd_avx2(local_620,_DAT_01faff00);
                      auVar137 = _DAT_01fe9960 & ~auVar118;
                      if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar137 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar137 >> 0x7f,0) == '\0') &&
                            (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar137 >> 0xbf,0) == '\0') &&
                          (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar137[0x1f]) {
                        auVar118 = auVar118 ^ _DAT_01fe9960;
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar213 = ZEXT1664(auVar213._0_16_);
                          (*p_Var11)(&local_730);
                        }
                        auVar137 = vpcmpeqd_avx2(local_620,_DAT_01faff00);
                        auVar118 = auVar137 ^ _DAT_01fe9960;
                        auVar156._8_4_ = 0xff800000;
                        auVar156._0_8_ = 0xff800000ff800000;
                        auVar156._12_4_ = 0xff800000;
                        auVar156._16_4_ = 0xff800000;
                        auVar156._20_4_ = 0xff800000;
                        auVar156._24_4_ = 0xff800000;
                        auVar156._28_4_ = 0xff800000;
                        auVar137 = vblendvps_avx(auVar156,*(undefined1 (*) [32])
                                                           (local_730.ray + 0x100),auVar137);
                        *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar137;
                      }
                      if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar118 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar118 >> 0x7f,0) != '\0') ||
                            (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar118 >> 0xbf,0) != '\0') ||
                          (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar118[0x1f] < '\0') {
                        bVar95 = 1;
                        goto LAB_015a316f;
                      }
                      *(undefined4 *)(ray + k * 4 + 0x100) = local_660._0_4_;
                      uVar99 = (ulong)local_820 ^ 1L << (local_920._0_8_ & 0x3f);
                      bVar95 = 0;
                      local_820 = (undefined1  [8])uVar99;
                      lVar24 = 0;
                      for (uVar98 = uVar99; (uVar98 & 1) == 0;
                          uVar98 = uVar98 >> 1 | 0x8000000000000000) {
                        lVar24 = lVar24 + 1;
                      }
                      local_920._0_8_ = lVar24;
                      auVar139 = ZEXT3264(local_680);
                      auVar199 = ZEXT3264(local_6e0);
                      auVar188 = ZEXT3264(CONCAT428(fVar208,CONCAT424(fVar208,CONCAT420(fVar208,
                                                  CONCAT416(fVar208,CONCAT412(fVar208,CONCAT48(
                                                  fVar208,CONCAT44(fVar208,fVar208))))))));
                      auVar184 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar157,CONCAT420(fVar163,
                                                  CONCAT416(fVar157,CONCAT412(fVar163,CONCAT48(
                                                  fVar157,uVar105)))))));
                    } while (uVar99 != 0);
                  }
                }
                auVar207 = ZEXT3264(auVar111);
                uVar98 = (ulong)CONCAT31(local_6c0._1_3_,local_6c0[0] | bVar95);
              }
            }
          }
          local_680 = auVar139._0_32_;
          uVar97 = (uint)uVar98;
          lVar103 = lVar103 + 8;
        } while ((int)lVar103 < iVar96);
      }
      bVar95 = (byte)uVar97;
      if ((uVar97 & 1) != 0) break;
      uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar110._4_4_ = uVar104;
      auVar110._0_4_ = uVar104;
      auVar110._8_4_ = uVar104;
      auVar110._12_4_ = uVar104;
      auVar12 = vcmpps_avx(local_3e0,auVar110,2);
      uVar100 = vmovmskps_avx(auVar12);
      uVar100 = (uint)uVar101 & uVar100;
    } while (uVar100 != 0);
  }
  return (bool)(bVar95 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }